

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O1

void opj_t1_dec_clnpass(opj_t1_t *t1,OPJ_INT32 bpno,OPJ_INT32 cblksty)

{
  OPJ_BYTE **ppOVar1;
  OPJ_UINT32 *pOVar2;
  byte *pbVar3;
  opj_mqc_state_t **ppoVar4;
  opj_mqc_state_t **ppoVar5;
  byte bVar6;
  opj_mqc_state_t *poVar7;
  OPJ_BYTE *pOVar8;
  ulong uVar9;
  uint *puVar10;
  uint *puVar11;
  uint uVar12;
  ulong uVar13;
  opj_flag_t *flagsp;
  OPJ_INT32 *data;
  uint *puVar14;
  opj_mqc_state_t **ppoVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint *puVar23;
  OPJ_UINT32 c;
  OPJ_UINT32 OVar24;
  uint uVar25;
  OPJ_UINT32 OVar26;
  uint uVar27;
  uint uVar28;
  OPJ_UINT32 OVar29;
  opj_mqc_t *mqc_2;
  ulong uVar30;
  OPJ_UINT32 OVar31;
  uint uVar32;
  OPJ_UINT32 i;
  int iVar33;
  bool bVar34;
  opj_mqc_t *mqc;
  OPJ_INT32 oneplushalf;
  
  uVar12 = t1->w;
  uVar30 = (ulong)uVar12;
  if ((uVar30 == 0x40) && (t1->h == 0x40)) {
    puVar10 = t1->flags + 0x43;
    uVar16 = (uint)(1 << ((byte)bpno & 0x1f)) >> 1 | 1 << (bpno & 0x1fU);
    ppOVar1 = &(t1->mqc).bp;
    pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
    uVar17 = -uVar16;
    ppoVar4 = (t1->mqc).ctxs + 0x11;
    ppoVar5 = (t1->mqc).ctxs + 0x12;
    puVar14 = (uint *)t1->data;
    ppoVar15 = (t1->mqc).curctx;
    OVar24 = (t1->mqc).c;
    uVar12 = (t1->mqc).a;
    OVar29 = (t1->mqc).ct;
    if ((cblksty & 8U) != 0) {
      uVar27 = 0;
LAB_0013c203:
      iVar33 = 0;
LAB_0013c20b:
      puVar23 = puVar14;
      puVar11 = puVar10;
      uVar25 = *puVar11;
      uVar30 = (ulong)uVar25;
      if (uVar30 != 0) {
        if ((uVar25 & 0x200010) == 0) {
          bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar25 & 0x1ef];
          ppoVar15 = (t1->mqc).ctxs + bVar6;
          poVar7 = (t1->mqc).ctxs[bVar6];
          uVar20 = poVar7->qeval;
          uVar12 = uVar12 - uVar20;
          if (OVar24 >> 0x10 < uVar20) {
            uVar18 = (uint)(poVar7->mps == 0);
            if (uVar20 > uVar12) {
              uVar18 = poVar7->mps;
            }
            *ppoVar15 = (&poVar7->nmps)[uVar20 <= uVar12];
            uVar12 = uVar20;
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_0013c2c0;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_0013c2c0:
              uVar12 = uVar12 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar12 < 0x8000);
          }
          else {
            OVar24 = OVar24 + uVar20 * -0x10000;
            if ((short)uVar12 < 0) {
              uVar18 = poVar7->mps;
            }
            else {
              uVar18 = (uint)(poVar7->mps == 0);
              if (uVar12 >= uVar20) {
                uVar18 = poVar7->mps;
              }
              *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar20];
              do {
                if (OVar29 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x200;
                      OVar29 = 7;
                      goto LAB_0013c490;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x100;
                  }
                  OVar29 = 8;
                }
LAB_0013c490:
                uVar12 = uVar12 * 2;
                OVar24 = OVar24 * 2;
                OVar29 = OVar29 - 1;
              } while (uVar12 < 0x8000);
            }
          }
          if (uVar18 != 0) {
            uVar18 = uVar25 >> 0x10 & 0x40 | uVar25 & 0xaa | uVar25 >> 0xe & 0x10 |
                     puVar11[-1] >> 0x13 & 1 | puVar11[1] >> 0x11 & 4;
            ppoVar15 = (t1->mqc).ctxs +
                       "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                       [uVar18];
            poVar7 = *ppoVar15;
            uVar20 = poVar7->qeval;
            uVar12 = uVar12 - uVar20;
            if (OVar24 >> 0x10 < uVar20) {
              uVar32 = (uint)(poVar7->mps == 0);
              if (uVar20 > uVar12) {
                uVar32 = poVar7->mps;
              }
              *ppoVar15 = (&poVar7->nmps)[uVar20 <= uVar12];
              uVar12 = uVar20;
              do {
                if (OVar29 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x200;
                      OVar29 = 7;
                      goto LAB_0013c6eb;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x100;
                  }
                  OVar29 = 8;
                }
LAB_0013c6eb:
                uVar12 = uVar12 * 2;
                OVar24 = OVar24 * 2;
                OVar29 = OVar29 - 1;
              } while (uVar12 < 0x8000);
            }
            else {
              OVar24 = OVar24 + uVar20 * -0x10000;
              if ((short)uVar12 < 0) {
                uVar32 = poVar7->mps;
              }
              else {
                uVar32 = (uint)(poVar7->mps == 0);
                if (uVar12 >= uVar20) {
                  uVar32 = poVar7->mps;
                }
                *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar20];
                do {
                  if (OVar29 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar24 = OVar24 + (uint)bVar6 * 0x200;
                        OVar29 = 7;
                        goto LAB_0013c795;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x100;
                    }
                    OVar29 = 8;
                  }
LAB_0013c795:
                  uVar12 = uVar12 * 2;
                  OVar24 = OVar24 * 2;
                  OVar29 = OVar29 - 1;
                } while (uVar12 < 0x8000);
              }
            }
            bVar6 = ""[uVar18];
            uVar20 = uVar17;
            if (uVar32 == bVar6) {
              uVar20 = uVar16;
            }
            *puVar23 = uVar20;
            *(byte *)(puVar11 + -1) = (byte)puVar11[-1] | 0x20;
            *(byte *)(puVar11 + 1) = (byte)puVar11[1] | 8;
            uVar30 = (ulong)((uVar32 ^ bVar6) << 0x13 | uVar25 | 0x10);
          }
        }
        if ((uVar30 & 0x1000080) == 0) {
          uVar20 = (uint)(uVar30 >> 3);
          bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar20 & 0x1ef];
          ppoVar15 = (t1->mqc).ctxs + bVar6;
          poVar7 = (t1->mqc).ctxs[bVar6];
          uVar25 = poVar7->qeval;
          uVar12 = uVar12 - uVar25;
          if (OVar24 >> 0x10 < uVar25) {
            uVar18 = (uint)(poVar7->mps == 0);
            if (uVar25 > uVar12) {
              uVar18 = poVar7->mps;
            }
            *ppoVar15 = (&poVar7->nmps)[uVar25 <= uVar12];
            uVar12 = uVar25;
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_0013cb02;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_0013cb02:
              uVar12 = uVar12 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar12 < 0x8000);
          }
          else {
            OVar24 = OVar24 + uVar25 * -0x10000;
            if ((short)uVar12 < 0) {
              uVar18 = poVar7->mps;
            }
            else {
              uVar18 = (uint)(poVar7->mps == 0);
              if (uVar12 >= uVar25) {
                uVar18 = poVar7->mps;
              }
              *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar25];
              do {
                if (OVar29 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x200;
                      OVar29 = 7;
                      goto LAB_0013cba2;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x100;
                  }
                  OVar29 = 8;
                }
LAB_0013cba2:
                uVar12 = uVar12 * 2;
                OVar24 = OVar24 * 2;
                OVar29 = OVar29 - 1;
              } while (uVar12 < 0x8000);
            }
          }
          if (uVar18 != 0) {
            uVar20 = (uint)(uVar30 >> 0x13) & 0x40 | uVar20 & 0xaa | (uint)(uVar30 >> 0xf) & 0x10 |
                     puVar11[-1] >> 0x16 & 1 | puVar11[1] >> 0x14 & 4;
            ppoVar15 = (t1->mqc).ctxs +
                       "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                       [uVar20];
            poVar7 = *ppoVar15;
            uVar25 = poVar7->qeval;
            uVar12 = uVar12 - uVar25;
            if (OVar24 >> 0x10 < uVar25) {
              uVar18 = (uint)(poVar7->mps == 0);
              if (uVar25 > uVar12) {
                uVar18 = poVar7->mps;
              }
              *ppoVar15 = (&poVar7->nmps)[uVar25 <= uVar12];
              uVar12 = uVar25;
              do {
                if (OVar29 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x200;
                      OVar29 = 7;
                      goto LAB_0013ccad;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x100;
                  }
                  OVar29 = 8;
                }
LAB_0013ccad:
                uVar12 = uVar12 * 2;
                OVar24 = OVar24 * 2;
                OVar29 = OVar29 - 1;
              } while (uVar12 < 0x8000);
            }
            else {
              OVar24 = OVar24 + uVar25 * -0x10000;
              if ((short)uVar12 < 0) {
                uVar18 = poVar7->mps;
              }
              else {
                uVar18 = (uint)(poVar7->mps == 0);
                if (uVar12 >= uVar25) {
                  uVar18 = poVar7->mps;
                }
                *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar25];
                do {
                  if (OVar29 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar24 = OVar24 + (uint)bVar6 * 0x200;
                        OVar29 = 7;
                        goto LAB_0013cd4d;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x100;
                    }
                    OVar29 = 8;
                  }
LAB_0013cd4d:
                  uVar12 = uVar12 * 2;
                  OVar24 = OVar24 * 2;
                  OVar29 = OVar29 - 1;
                } while (uVar12 < 0x8000);
              }
            }
            bVar6 = ""[uVar20];
            uVar25 = uVar17;
            if (uVar18 == bVar6) {
              uVar25 = uVar16;
            }
            puVar23[0x40] = uVar25;
            *(byte *)((long)puVar11 + -3) = *(byte *)((long)puVar11 + -3) | 1;
            uVar30 = (ulong)((uint)uVar30 | (uVar18 ^ bVar6) << 0x16 | 0x80);
            *(byte *)(puVar11 + 1) = (byte)puVar11[1] | 0x40;
          }
        }
        if ((uVar30 & 0x8000400) == 0) {
          uVar20 = (uint)(uVar30 >> 6);
          bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar20 & 0x1ef];
          ppoVar15 = (t1->mqc).ctxs + bVar6;
          poVar7 = (t1->mqc).ctxs[bVar6];
          uVar25 = poVar7->qeval;
          uVar12 = uVar12 - uVar25;
          if (OVar24 >> 0x10 < uVar25) {
            uVar18 = (uint)(poVar7->mps == 0);
            if (uVar25 > uVar12) {
              uVar18 = poVar7->mps;
            }
            *ppoVar15 = (&poVar7->nmps)[uVar25 <= uVar12];
            uVar12 = uVar25;
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_0013ce6c;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_0013ce6c:
              uVar12 = uVar12 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar12 < 0x8000);
          }
          else {
            OVar24 = OVar24 + uVar25 * -0x10000;
            if ((short)uVar12 < 0) {
              uVar18 = poVar7->mps;
            }
            else {
              uVar18 = (uint)(poVar7->mps == 0);
              if (uVar12 >= uVar25) {
                uVar18 = poVar7->mps;
              }
              *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar25];
              do {
                if (OVar29 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x200;
                      OVar29 = 7;
                      goto LAB_0013cf07;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x100;
                  }
                  OVar29 = 8;
                }
LAB_0013cf07:
                uVar12 = uVar12 * 2;
                OVar24 = OVar24 * 2;
                OVar29 = OVar29 - 1;
              } while (uVar12 < 0x8000);
            }
          }
          if (uVar18 != 0) {
            uVar20 = (uint)(uVar30 >> 0x16) & 0x40 | uVar20 & 0xaa | (uint)(uVar30 >> 0x12) & 0x10 |
                     puVar11[-1] >> 0x19 & 1 | puVar11[1] >> 0x17 & 4;
            ppoVar15 = (t1->mqc).ctxs +
                       "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                       [uVar20];
            poVar7 = *ppoVar15;
            uVar25 = poVar7->qeval;
            uVar12 = uVar12 - uVar25;
            if (OVar24 >> 0x10 < uVar25) {
              uVar18 = (uint)(poVar7->mps == 0);
              if (uVar25 > uVar12) {
                uVar18 = poVar7->mps;
              }
              *ppoVar15 = (&poVar7->nmps)[uVar25 <= uVar12];
              uVar12 = uVar25;
              do {
                if (OVar29 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x200;
                      OVar29 = 7;
                      goto LAB_0013d003;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x100;
                  }
                  OVar29 = 8;
                }
LAB_0013d003:
                uVar12 = uVar12 * 2;
                OVar24 = OVar24 * 2;
                OVar29 = OVar29 - 1;
              } while (uVar12 < 0x8000);
            }
            else {
              OVar24 = OVar24 + uVar25 * -0x10000;
              if ((short)uVar12 < 0) {
                uVar18 = poVar7->mps;
              }
              else {
                uVar18 = (uint)(poVar7->mps == 0);
                if (uVar12 >= uVar25) {
                  uVar18 = poVar7->mps;
                }
                *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar25];
                do {
                  if (OVar29 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar24 = OVar24 + (uint)bVar6 * 0x200;
                        OVar29 = 7;
                        goto LAB_0013d0ad;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x100;
                    }
                    OVar29 = 8;
                  }
LAB_0013d0ad:
                  uVar12 = uVar12 * 2;
                  OVar24 = OVar24 * 2;
                  OVar29 = OVar29 - 1;
                } while (uVar12 < 0x8000);
              }
            }
            bVar6 = ""[uVar20];
            uVar25 = uVar17;
            if (uVar18 == bVar6) {
              uVar25 = uVar16;
            }
            puVar23[0x80] = uVar25;
            *(byte *)((long)puVar11 + -3) = *(byte *)((long)puVar11 + -3) | 8;
            uVar30 = (ulong)((uint)uVar30 | (uVar18 ^ bVar6) << 0x19 | 0x400);
            *(byte *)((long)puVar11 + 5) = *(byte *)((long)puVar11 + 5) | 2;
          }
        }
        uVar25 = (uint)uVar30;
        if ((uVar30 & 0x40002000) == 0) {
          uVar18 = (uint)(uVar30 >> 9);
          bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar18 & 0x1ef];
          ppoVar15 = (t1->mqc).ctxs + bVar6;
          poVar7 = (t1->mqc).ctxs[bVar6];
          uVar20 = poVar7->qeval;
          uVar12 = uVar12 - uVar20;
          if (OVar24 >> 0x10 < uVar20) {
            uVar32 = (uint)(poVar7->mps == 0);
            if (uVar20 > uVar12) {
              uVar32 = poVar7->mps;
            }
            *ppoVar15 = (&poVar7->nmps)[uVar20 <= uVar12];
            uVar12 = uVar20;
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_0013d1cc;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_0013d1cc:
              uVar12 = uVar12 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar12 < 0x8000);
          }
          else {
            OVar24 = OVar24 + uVar20 * -0x10000;
            if ((short)uVar12 < 0) {
              uVar32 = poVar7->mps;
            }
            else {
              uVar32 = (uint)(poVar7->mps == 0);
              if (uVar12 >= uVar20) {
                uVar32 = poVar7->mps;
              }
              *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar20];
              do {
                if (OVar29 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x200;
                      OVar29 = 7;
                      goto LAB_0013d26c;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x100;
                  }
                  OVar29 = 8;
                }
LAB_0013d26c:
                uVar12 = uVar12 * 2;
                OVar24 = OVar24 * 2;
                OVar29 = OVar29 - 1;
              } while (uVar12 < 0x8000);
            }
          }
          if (uVar32 != 0) {
            uVar18 = (uint)(uVar30 >> 0x19) & 0x40 | uVar18 & 0xaa | (uint)(uVar30 >> 0x15) & 0x10 |
                     puVar11[-1] >> 0x1c & 1 | puVar11[1] >> 0x1a & 4;
            ppoVar15 = (t1->mqc).ctxs +
                       "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                       [uVar18];
            poVar7 = *ppoVar15;
            uVar20 = poVar7->qeval;
            uVar12 = uVar12 - uVar20;
            if (OVar24 >> 0x10 < uVar20) {
              uVar32 = (uint)(poVar7->mps == 0);
              if (uVar20 > uVar12) {
                uVar32 = poVar7->mps;
              }
              *ppoVar15 = (&poVar7->nmps)[uVar20 <= uVar12];
              uVar12 = uVar20;
              do {
                if (OVar29 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x200;
                      OVar29 = 7;
                      goto LAB_0013d36d;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x100;
                  }
                  OVar29 = 8;
                }
LAB_0013d36d:
                uVar12 = uVar12 * 2;
                OVar24 = OVar24 * 2;
                OVar29 = OVar29 - 1;
              } while (uVar12 < 0x8000);
            }
            else {
              OVar24 = OVar24 + uVar20 * -0x10000;
              if ((short)uVar12 < 0) {
                uVar32 = poVar7->mps;
              }
              else {
                uVar32 = (uint)(poVar7->mps == 0);
                if (uVar12 >= uVar20) {
                  uVar32 = poVar7->mps;
                }
                *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar20];
                do {
                  if (OVar29 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar24 = OVar24 + (uint)bVar6 * 0x200;
                        OVar29 = 7;
                        goto LAB_0013d412;
                      }
                      OVar24 = OVar24 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x100;
                    }
                    OVar29 = 8;
                  }
LAB_0013d412:
                  uVar12 = uVar12 * 2;
                  OVar24 = OVar24 * 2;
                  OVar29 = OVar29 - 1;
                } while (uVar12 < 0x8000);
              }
            }
            uVar19 = uVar32 ^ ""[uVar18];
            uVar20 = uVar17;
            if (uVar32 == ""[uVar18]) {
              uVar20 = uVar16;
            }
            puVar23[0xc0] = uVar20;
            *(byte *)((long)puVar11 + -3) = *(byte *)((long)puVar11 + -3) | 0x40;
            *(byte *)((long)puVar11 + 5) = *(byte *)((long)puVar11 + 5) | 0x10;
            puVar11[0x42] = uVar19 << 0x12 | puVar11[0x42] | 2;
            *(byte *)(puVar11 + 0x41) = (byte)puVar11[0x41] | 4;
            uVar25 = uVar25 | uVar19 << 0x1c | 0x2000;
            *(byte *)(puVar11 + 0x43) = (byte)puVar11[0x43] | 1;
          }
        }
LAB_0013dfd0:
        *puVar11 = uVar25 & 0xb6dfffff;
        goto LAB_0013dfda;
      }
      poVar7 = *ppoVar4;
      uVar25 = poVar7->qeval;
      uVar12 = uVar12 - uVar25;
      if (OVar24 >> 0x10 < uVar25) {
        uVar20 = (uint)(poVar7->mps == 0);
        if (uVar25 > uVar12) {
          uVar20 = poVar7->mps;
        }
        *ppoVar4 = (&poVar7->nmps)[uVar25 <= uVar12];
        uVar12 = uVar25;
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_0013c361;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_0013c361:
          uVar12 = uVar12 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar12 < 0x8000);
      }
      else {
        OVar24 = OVar24 + uVar25 * -0x10000;
        if ((short)uVar12 < 0) {
          uVar20 = poVar7->mps;
        }
        else {
          uVar20 = (uint)(poVar7->mps == 0);
          if (uVar12 >= uVar25) {
            uVar20 = poVar7->mps;
          }
          *ppoVar4 = (&poVar7->nmps)[uVar12 < uVar25];
          do {
            if (OVar29 == 0) {
              pOVar8 = *ppOVar1;
              bVar6 = pOVar8[1];
              if (*pOVar8 == 0xff) {
                if (bVar6 < 0x90) {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x200;
                  OVar29 = 7;
                  goto LAB_0013c3f5;
                }
                OVar24 = OVar24 + 0xff00;
                *pOVar2 = *pOVar2 + 1;
              }
              else {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x100;
              }
              OVar29 = 8;
            }
LAB_0013c3f5:
            uVar12 = uVar12 * 2;
            OVar24 = OVar24 * 2;
            OVar29 = OVar29 - 1;
          } while (uVar12 < 0x8000);
        }
      }
      if (uVar20 != 0) {
        poVar7 = *ppoVar5;
        uVar25 = poVar7->qeval;
        uVar12 = uVar12 - uVar25;
        if (OVar24 >> 0x10 < uVar25) {
          OVar26 = (uint)(poVar7->mps == 0);
          if (uVar25 > uVar12) {
            OVar26 = poVar7->mps;
          }
          *ppoVar5 = (&poVar7->nmps)[uVar25 <= uVar12];
          do {
            if (OVar29 == 0) {
              pOVar8 = *ppOVar1;
              bVar6 = pOVar8[1];
              if (*pOVar8 == 0xff) {
                if (bVar6 < 0x90) {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x200;
                  OVar29 = 7;
                  goto LAB_0013c545;
                }
                OVar24 = OVar24 + 0xff00;
                *pOVar2 = *pOVar2 + 1;
              }
              else {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x100;
              }
              OVar29 = 8;
            }
LAB_0013c545:
            uVar25 = uVar25 * 2;
            OVar24 = OVar24 * 2;
            OVar29 = OVar29 - 1;
          } while (uVar25 < 0x8000);
        }
        else {
          OVar24 = OVar24 + uVar25 * -0x10000;
          if ((short)uVar12 < 0) {
            OVar26 = poVar7->mps;
            uVar25 = uVar12;
          }
          else {
            OVar26 = (uint)(poVar7->mps == 0);
            if (uVar12 >= uVar25) {
              OVar26 = poVar7->mps;
            }
            *ppoVar5 = (&poVar7->nmps)[uVar12 < uVar25];
            uVar25 = uVar12;
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_0013c5e1;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_0013c5e1:
              uVar25 = uVar25 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar25 < 0x8000);
          }
        }
        poVar7 = *ppoVar5;
        uVar18 = poVar7->qeval;
        uVar12 = uVar25 - uVar18;
        if (OVar24 >> 0x10 < uVar18) {
          uVar32 = (uint)(poVar7->mps == 0);
          if (uVar18 > uVar12) {
            uVar32 = poVar7->mps;
          }
          *ppoVar5 = (&poVar7->nmps)[uVar18 <= uVar12];
          uVar12 = uVar18;
          do {
            if (OVar29 == 0) {
              pOVar8 = *ppOVar1;
              bVar6 = pOVar8[1];
              if (*pOVar8 == 0xff) {
                if (bVar6 < 0x90) {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x200;
                  OVar29 = 7;
                  goto LAB_0013c843;
                }
                OVar24 = OVar24 + 0xff00;
                *pOVar2 = *pOVar2 + 1;
              }
              else {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x100;
              }
              OVar29 = 8;
            }
LAB_0013c843:
            uVar12 = uVar12 * 2;
            OVar24 = OVar24 * 2;
            OVar29 = OVar29 - 1;
          } while (uVar12 < 0x8000);
        }
        else {
          OVar24 = OVar24 + uVar18 * -0x10000;
          if ((short)uVar12 < 0) {
            uVar32 = poVar7->mps;
          }
          else {
            uVar32 = (uint)(poVar7->mps == 0);
            if (uVar12 >= uVar18) {
              uVar32 = poVar7->mps;
            }
            *ppoVar5 = (&poVar7->nmps)[uVar12 < uVar18];
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_0013c8dd;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_0013c8dd:
              uVar12 = uVar12 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar12 < 0x8000);
          }
        }
        uVar32 = OVar26 * 2 | uVar32;
        uVar30 = 0;
        uVar25 = 0;
        ppoVar15 = ppoVar5;
        switch(uVar32) {
        case 0:
          goto switchD_0013c928_caseD_0;
        case 1:
          goto switchD_0013c928_caseD_1;
        case 2:
          bVar34 = false;
          goto LAB_0013d8ea;
        case 3:
          bVar34 = false;
          goto LAB_0013dc3c;
        default:
          goto switchD_0013c928_default;
        }
      }
      uVar25 = 0;
      ppoVar15 = ppoVar4;
      goto switchD_0013c928_default;
    }
    uVar27 = 0;
LAB_001369a7:
    iVar33 = 0;
LAB_001369af:
    puVar23 = puVar14;
    puVar11 = puVar10;
    uVar25 = *puVar11;
    uVar30 = (ulong)uVar25;
    if (uVar30 != 0) {
      if ((uVar25 & 0x200010) == 0) {
        bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar25 & 0x1ef];
        ppoVar15 = (t1->mqc).ctxs + bVar6;
        poVar7 = (t1->mqc).ctxs[bVar6];
        uVar20 = poVar7->qeval;
        uVar12 = uVar12 - uVar20;
        if (OVar24 >> 0x10 < uVar20) {
          uVar18 = (uint)(poVar7->mps == 0);
          if (uVar20 > uVar12) {
            uVar18 = poVar7->mps;
          }
          *ppoVar15 = (&poVar7->nmps)[uVar20 <= uVar12];
          uVar12 = uVar20;
          do {
            if (OVar29 == 0) {
              pOVar8 = *ppOVar1;
              bVar6 = pOVar8[1];
              if (*pOVar8 == 0xff) {
                if (bVar6 < 0x90) {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x200;
                  OVar29 = 7;
                  goto LAB_00136a64;
                }
                OVar24 = OVar24 + 0xff00;
                *pOVar2 = *pOVar2 + 1;
              }
              else {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x100;
              }
              OVar29 = 8;
            }
LAB_00136a64:
            uVar12 = uVar12 * 2;
            OVar24 = OVar24 * 2;
            OVar29 = OVar29 - 1;
          } while (uVar12 < 0x8000);
        }
        else {
          OVar24 = OVar24 + uVar20 * -0x10000;
          if ((short)uVar12 < 0) {
            uVar18 = poVar7->mps;
          }
          else {
            uVar18 = (uint)(poVar7->mps == 0);
            if (uVar12 >= uVar20) {
              uVar18 = poVar7->mps;
            }
            *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar20];
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_00136c16;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_00136c16:
              uVar12 = uVar12 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar12 < 0x8000);
          }
        }
        if (uVar18 != 0) {
          uVar18 = uVar25 >> 0x10 & 0x40 | uVar25 & 0xaa | uVar25 >> 0xe & 0x10 |
                   puVar11[-1] >> 0x13 & 1 | puVar11[1] >> 0x11 & 4;
          ppoVar15 = (t1->mqc).ctxs +
                     "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                     [uVar18];
          poVar7 = *ppoVar15;
          uVar20 = poVar7->qeval;
          uVar12 = uVar12 - uVar20;
          if (OVar24 >> 0x10 < uVar20) {
            uVar32 = (uint)(poVar7->mps == 0);
            if (uVar20 > uVar12) {
              uVar32 = poVar7->mps;
            }
            *ppoVar15 = (&poVar7->nmps)[uVar20 <= uVar12];
            uVar12 = uVar20;
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_00136e63;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_00136e63:
              uVar12 = uVar12 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar12 < 0x8000);
          }
          else {
            OVar24 = OVar24 + uVar20 * -0x10000;
            if ((short)uVar12 < 0) {
              uVar32 = poVar7->mps;
            }
            else {
              uVar32 = (uint)(poVar7->mps == 0);
              if (uVar12 >= uVar20) {
                uVar32 = poVar7->mps;
              }
              *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar20];
              do {
                if (OVar29 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x200;
                      OVar29 = 7;
                      goto LAB_00136f0d;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x100;
                  }
                  OVar29 = 8;
                }
LAB_00136f0d:
                uVar12 = uVar12 * 2;
                OVar24 = OVar24 * 2;
                OVar29 = OVar29 - 1;
              } while (uVar12 < 0x8000);
            }
          }
          uVar19 = uVar32 ^ ""[uVar18];
          uVar20 = uVar17;
          if (uVar32 == ""[uVar18]) {
            uVar20 = uVar16;
          }
          *puVar23 = uVar20;
          *(byte *)(puVar11 + -1) = (byte)puVar11[-1] | 0x20;
          *(byte *)(puVar11 + 1) = (byte)puVar11[1] | 8;
          puVar11[-0x42] = uVar19 << 0x1f | puVar11[-0x42] | 0x10000;
          *(byte *)((long)puVar11 + -0x10a) = *(byte *)((long)puVar11 + -0x10a) | 2;
          *(byte *)((long)puVar11 + -0x103) = *(byte *)((long)puVar11 + -0x103) | 0x80;
          uVar30 = (ulong)(uVar19 << 0x13 | uVar25 | 0x10);
        }
      }
      if ((uVar30 & 0x1000080) == 0) {
        uVar20 = (uint)(uVar30 >> 3);
        bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar20 & 0x1ef];
        ppoVar15 = (t1->mqc).ctxs + bVar6;
        poVar7 = (t1->mqc).ctxs[bVar6];
        uVar25 = poVar7->qeval;
        uVar12 = uVar12 - uVar25;
        if (OVar24 >> 0x10 < uVar25) {
          uVar18 = (uint)(poVar7->mps == 0);
          if (uVar25 > uVar12) {
            uVar18 = poVar7->mps;
          }
          *ppoVar15 = (&poVar7->nmps)[uVar25 <= uVar12];
          uVar12 = uVar25;
          do {
            if (OVar29 == 0) {
              pOVar8 = *ppOVar1;
              bVar6 = pOVar8[1];
              if (*pOVar8 == 0xff) {
                if (bVar6 < 0x90) {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x200;
                  OVar29 = 7;
                  goto LAB_0013728d;
                }
                OVar24 = OVar24 + 0xff00;
                *pOVar2 = *pOVar2 + 1;
              }
              else {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x100;
              }
              OVar29 = 8;
            }
LAB_0013728d:
            uVar12 = uVar12 * 2;
            OVar24 = OVar24 * 2;
            OVar29 = OVar29 - 1;
          } while (uVar12 < 0x8000);
        }
        else {
          OVar24 = OVar24 + uVar25 * -0x10000;
          if ((short)uVar12 < 0) {
            uVar18 = poVar7->mps;
          }
          else {
            uVar18 = (uint)(poVar7->mps == 0);
            if (uVar12 >= uVar25) {
              uVar18 = poVar7->mps;
            }
            *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar25];
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_00137327;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_00137327:
              uVar12 = uVar12 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar12 < 0x8000);
          }
        }
        if (uVar18 != 0) {
          uVar20 = (uint)(uVar30 >> 0x13) & 0x40 | uVar20 & 0xaa | (uint)(uVar30 >> 0xf) & 0x10 |
                   puVar11[-1] >> 0x16 & 1 | puVar11[1] >> 0x14 & 4;
          ppoVar15 = (t1->mqc).ctxs +
                     "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                     [uVar20];
          poVar7 = *ppoVar15;
          uVar25 = poVar7->qeval;
          uVar12 = uVar12 - uVar25;
          if (OVar24 >> 0x10 < uVar25) {
            uVar18 = (uint)(poVar7->mps == 0);
            if (uVar25 > uVar12) {
              uVar18 = poVar7->mps;
            }
            *ppoVar15 = (&poVar7->nmps)[uVar25 <= uVar12];
            uVar12 = uVar25;
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_00137421;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_00137421:
              uVar12 = uVar12 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar12 < 0x8000);
          }
          else {
            OVar24 = OVar24 + uVar25 * -0x10000;
            if ((short)uVar12 < 0) {
              uVar18 = poVar7->mps;
            }
            else {
              uVar18 = (uint)(poVar7->mps == 0);
              if (uVar12 >= uVar25) {
                uVar18 = poVar7->mps;
              }
              *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar25];
              do {
                if (OVar29 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x200;
                      OVar29 = 7;
                      goto LAB_001374c6;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x100;
                  }
                  OVar29 = 8;
                }
LAB_001374c6:
                uVar12 = uVar12 * 2;
                OVar24 = OVar24 * 2;
                OVar29 = OVar29 - 1;
              } while (uVar12 < 0x8000);
            }
          }
          bVar6 = ""[uVar20];
          uVar25 = uVar17;
          if (uVar18 == bVar6) {
            uVar25 = uVar16;
          }
          puVar23[0x40] = uVar25;
          *(byte *)((long)puVar11 + -3) = *(byte *)((long)puVar11 + -3) | 1;
          uVar30 = (ulong)((uint)uVar30 | (uVar18 ^ bVar6) << 0x16 | 0x80);
          *(byte *)(puVar11 + 1) = (byte)puVar11[1] | 0x40;
        }
      }
      if ((uVar30 & 0x8000400) == 0) {
        uVar20 = (uint)(uVar30 >> 6);
        bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar20 & 0x1ef];
        ppoVar15 = (t1->mqc).ctxs + bVar6;
        poVar7 = (t1->mqc).ctxs[bVar6];
        uVar25 = poVar7->qeval;
        uVar12 = uVar12 - uVar25;
        if (OVar24 >> 0x10 < uVar25) {
          uVar18 = (uint)(poVar7->mps == 0);
          if (uVar25 > uVar12) {
            uVar18 = poVar7->mps;
          }
          *ppoVar15 = (&poVar7->nmps)[uVar25 <= uVar12];
          uVar12 = uVar25;
          do {
            if (OVar29 == 0) {
              pOVar8 = *ppOVar1;
              bVar6 = pOVar8[1];
              if (*pOVar8 == 0xff) {
                if (bVar6 < 0x90) {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x200;
                  OVar29 = 7;
                  goto LAB_001375e0;
                }
                OVar24 = OVar24 + 0xff00;
                *pOVar2 = *pOVar2 + 1;
              }
              else {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x100;
              }
              OVar29 = 8;
            }
LAB_001375e0:
            uVar12 = uVar12 * 2;
            OVar24 = OVar24 * 2;
            OVar29 = OVar29 - 1;
          } while (uVar12 < 0x8000);
        }
        else {
          OVar24 = OVar24 + uVar25 * -0x10000;
          if ((short)uVar12 < 0) {
            uVar18 = poVar7->mps;
          }
          else {
            uVar18 = (uint)(poVar7->mps == 0);
            if (uVar12 >= uVar25) {
              uVar18 = poVar7->mps;
            }
            *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar25];
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_00137675;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_00137675:
              uVar12 = uVar12 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar12 < 0x8000);
          }
        }
        if (uVar18 != 0) {
          uVar20 = (uint)(uVar30 >> 0x16) & 0x40 | uVar20 & 0xaa | (uint)(uVar30 >> 0x12) & 0x10 |
                   puVar11[-1] >> 0x19 & 1 | puVar11[1] >> 0x17 & 4;
          ppoVar15 = (t1->mqc).ctxs +
                     "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                     [uVar20];
          poVar7 = *ppoVar15;
          uVar25 = poVar7->qeval;
          uVar12 = uVar12 - uVar25;
          if (OVar24 >> 0x10 < uVar25) {
            uVar18 = (uint)(poVar7->mps == 0);
            if (uVar25 > uVar12) {
              uVar18 = poVar7->mps;
            }
            *ppoVar15 = (&poVar7->nmps)[uVar25 <= uVar12];
            uVar12 = uVar25;
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_0013776a;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_0013776a:
              uVar12 = uVar12 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar12 < 0x8000);
          }
          else {
            OVar24 = OVar24 + uVar25 * -0x10000;
            if ((short)uVar12 < 0) {
              uVar18 = poVar7->mps;
            }
            else {
              uVar18 = (uint)(poVar7->mps == 0);
              if (uVar12 >= uVar25) {
                uVar18 = poVar7->mps;
              }
              *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar25];
              do {
                if (OVar29 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x200;
                      OVar29 = 7;
                      goto LAB_00137814;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x100;
                  }
                  OVar29 = 8;
                }
LAB_00137814:
                uVar12 = uVar12 * 2;
                OVar24 = OVar24 * 2;
                OVar29 = OVar29 - 1;
              } while (uVar12 < 0x8000);
            }
          }
          bVar6 = ""[uVar20];
          uVar25 = uVar17;
          if (uVar18 == bVar6) {
            uVar25 = uVar16;
          }
          puVar23[0x80] = uVar25;
          *(byte *)((long)puVar11 + -3) = *(byte *)((long)puVar11 + -3) | 8;
          uVar30 = (ulong)((uint)uVar30 | (uVar18 ^ bVar6) << 0x19 | 0x400);
          *(byte *)((long)puVar11 + 5) = *(byte *)((long)puVar11 + 5) | 2;
        }
      }
      uVar25 = (uint)uVar30;
      if ((uVar30 & 0x40002000) == 0) {
        uVar18 = (uint)(uVar30 >> 9);
        bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar18 & 0x1ef];
        ppoVar15 = (t1->mqc).ctxs + bVar6;
        poVar7 = (t1->mqc).ctxs[bVar6];
        uVar20 = poVar7->qeval;
        uVar12 = uVar12 - uVar20;
        if (OVar24 >> 0x10 < uVar20) {
          uVar32 = (uint)(poVar7->mps == 0);
          if (uVar20 > uVar12) {
            uVar32 = poVar7->mps;
          }
          *ppoVar15 = (&poVar7->nmps)[uVar20 <= uVar12];
          uVar12 = uVar20;
          do {
            if (OVar29 == 0) {
              pOVar8 = *ppOVar1;
              bVar6 = pOVar8[1];
              if (*pOVar8 == 0xff) {
                if (bVar6 < 0x90) {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x200;
                  OVar29 = 7;
                  goto LAB_0013792e;
                }
                OVar24 = OVar24 + 0xff00;
                *pOVar2 = *pOVar2 + 1;
              }
              else {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x100;
              }
              OVar29 = 8;
            }
LAB_0013792e:
            uVar12 = uVar12 * 2;
            OVar24 = OVar24 * 2;
            OVar29 = OVar29 - 1;
          } while (uVar12 < 0x8000);
        }
        else {
          OVar24 = OVar24 + uVar20 * -0x10000;
          if ((short)uVar12 < 0) {
            uVar32 = poVar7->mps;
          }
          else {
            uVar32 = (uint)(poVar7->mps == 0);
            if (uVar12 >= uVar20) {
              uVar32 = poVar7->mps;
            }
            *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar20];
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_001379c8;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_001379c8:
              uVar12 = uVar12 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar12 < 0x8000);
          }
        }
        if (uVar32 != 0) {
          uVar18 = (uint)(uVar30 >> 0x19) & 0x40 | uVar18 & 0xaa | (uint)(uVar30 >> 0x15) & 0x10 |
                   puVar11[-1] >> 0x1c & 1 | puVar11[1] >> 0x1a & 4;
          ppoVar15 = (t1->mqc).ctxs +
                     "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                     [uVar18];
          poVar7 = *ppoVar15;
          uVar20 = poVar7->qeval;
          uVar12 = uVar12 - uVar20;
          if (OVar24 >> 0x10 < uVar20) {
            uVar32 = (uint)(poVar7->mps == 0);
            if (uVar20 > uVar12) {
              uVar32 = poVar7->mps;
            }
            *ppoVar15 = (&poVar7->nmps)[uVar20 <= uVar12];
            uVar12 = uVar20;
            do {
              if (OVar29 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x200;
                    OVar29 = 7;
                    goto LAB_00137acc;
                  }
                  OVar24 = OVar24 + 0xff00;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x100;
                }
                OVar29 = 8;
              }
LAB_00137acc:
              uVar12 = uVar12 * 2;
              OVar24 = OVar24 * 2;
              OVar29 = OVar29 - 1;
            } while (uVar12 < 0x8000);
          }
          else {
            OVar24 = OVar24 + uVar20 * -0x10000;
            if ((short)uVar12 < 0) {
              uVar32 = poVar7->mps;
            }
            else {
              uVar32 = (uint)(poVar7->mps == 0);
              if (uVar12 >= uVar20) {
                uVar32 = poVar7->mps;
              }
              *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar20];
              do {
                if (OVar29 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar24 = OVar24 + (uint)bVar6 * 0x200;
                      OVar29 = 7;
                      goto LAB_00137b6c;
                    }
                    OVar24 = OVar24 + 0xff00;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar24 = OVar24 + (uint)bVar6 * 0x100;
                  }
                  OVar29 = 8;
                }
LAB_00137b6c:
                uVar12 = uVar12 * 2;
                OVar24 = OVar24 * 2;
                OVar29 = OVar29 - 1;
              } while (uVar12 < 0x8000);
            }
          }
          uVar19 = uVar32 ^ ""[uVar18];
          uVar20 = uVar17;
          if (uVar32 == ""[uVar18]) {
            uVar20 = uVar16;
          }
          puVar23[0xc0] = uVar20;
          *(byte *)((long)puVar11 + -3) = *(byte *)((long)puVar11 + -3) | 0x40;
          *(byte *)((long)puVar11 + 5) = *(byte *)((long)puVar11 + 5) | 0x10;
          puVar11[0x42] = uVar19 << 0x12 | puVar11[0x42] | 2;
          *(byte *)(puVar11 + 0x41) = (byte)puVar11[0x41] | 4;
          uVar25 = uVar25 | uVar19 << 0x1c | 0x2000;
          *(byte *)(puVar11 + 0x43) = (byte)puVar11[0x43] | 1;
        }
      }
LAB_00138718:
      *puVar11 = uVar25 & 0xb6dfffff;
      goto LAB_00138723;
    }
    poVar7 = *ppoVar4;
    uVar25 = poVar7->qeval;
    uVar12 = uVar12 - uVar25;
    if (OVar24 >> 0x10 < uVar25) {
      OVar26 = (uint)(poVar7->mps == 0);
      if (uVar25 > uVar12) {
        OVar26 = poVar7->mps;
      }
      *ppoVar4 = (&poVar7->nmps)[uVar25 <= uVar12];
      uVar12 = uVar25;
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_00136af5;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_00136af5:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = OVar24 + uVar25 * -0x10000;
      if ((short)uVar12 < 0) {
        OVar26 = poVar7->mps;
      }
      else {
        OVar26 = (uint)(poVar7->mps == 0);
        if (uVar12 >= uVar25) {
          OVar26 = poVar7->mps;
        }
        *ppoVar4 = (&poVar7->nmps)[uVar12 < uVar25];
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_00136b7f;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_00136b7f:
          uVar12 = uVar12 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar12 < 0x8000);
      }
    }
    if (OVar26 != 0) {
      poVar7 = *ppoVar5;
      uVar25 = poVar7->qeval;
      uVar12 = uVar12 - uVar25;
      if (OVar24 >> 0x10 < uVar25) {
        OVar31 = (uint)(poVar7->mps == 0);
        if (uVar25 > uVar12) {
          OVar31 = poVar7->mps;
        }
        *ppoVar5 = (&poVar7->nmps)[uVar25 <= uVar12];
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_00136cc9;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_00136cc9:
          uVar25 = uVar25 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar25 < 0x8000);
      }
      else {
        OVar24 = OVar24 + uVar25 * -0x10000;
        if ((short)uVar12 < 0) {
          OVar31 = poVar7->mps;
          uVar25 = uVar12;
        }
        else {
          OVar31 = (uint)(poVar7->mps == 0);
          if (uVar12 >= uVar25) {
            OVar31 = poVar7->mps;
          }
          *ppoVar5 = (&poVar7->nmps)[uVar12 < uVar25];
          uVar25 = uVar12;
          do {
            if (OVar29 == 0) {
              pOVar8 = *ppOVar1;
              bVar6 = pOVar8[1];
              if (*pOVar8 == 0xff) {
                if (bVar6 < 0x90) {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x200;
                  OVar29 = 7;
                  goto LAB_00136d60;
                }
                OVar24 = OVar24 + 0xff00;
                *pOVar2 = *pOVar2 + 1;
              }
              else {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x100;
              }
              OVar29 = 8;
            }
LAB_00136d60:
            uVar25 = uVar25 * 2;
            OVar24 = OVar24 * 2;
            OVar29 = OVar29 - 1;
          } while (uVar25 < 0x8000);
        }
      }
      poVar7 = *ppoVar5;
      uVar20 = poVar7->qeval;
      uVar12 = uVar25 - uVar20;
      if (OVar24 >> 0x10 < uVar20) {
        uVar18 = (uint)(poVar7->mps == 0);
        if (uVar20 > uVar12) {
          uVar18 = poVar7->mps;
        }
        *ppoVar5 = (&poVar7->nmps)[uVar20 <= uVar12];
        uVar12 = uVar20;
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_00136faf;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_00136faf:
          uVar12 = uVar12 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar12 < 0x8000);
      }
      else {
        OVar24 = OVar24 + uVar20 * -0x10000;
        if ((short)uVar12 < 0) {
          uVar18 = poVar7->mps;
        }
        else {
          uVar18 = (uint)(poVar7->mps == 0);
          if (uVar12 >= uVar20) {
            uVar18 = poVar7->mps;
          }
          *ppoVar5 = (&poVar7->nmps)[uVar12 < uVar20];
          do {
            if (OVar29 == 0) {
              pOVar8 = *ppOVar1;
              bVar6 = pOVar8[1];
              if (*pOVar8 == 0xff) {
                if (bVar6 < 0x90) {
                  *ppOVar1 = pOVar8 + 1;
                  OVar24 = OVar24 + (uint)bVar6 * 0x200;
                  OVar29 = 7;
                  goto LAB_00137044;
                }
                OVar24 = OVar24 + 0xff00;
                *pOVar2 = *pOVar2 + 1;
              }
              else {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x100;
              }
              OVar29 = 8;
            }
LAB_00137044:
            uVar12 = uVar12 * 2;
            OVar24 = OVar24 * 2;
            OVar29 = OVar29 - 1;
          } while (uVar12 < 0x8000);
        }
      }
      uVar18 = OVar31 * 2 | uVar18;
      uVar30 = 0;
      uVar25 = 0;
      ppoVar15 = ppoVar5;
      switch(uVar18) {
      case 0:
        goto switchD_00137090_caseD_0;
      case 1:
        goto switchD_00137090_caseD_1;
      case 2:
        bVar34 = false;
        goto LAB_0013805b;
      case 3:
        bVar34 = false;
        goto LAB_00138399;
      default:
        goto switchD_00137090_default;
      }
    }
    uVar25 = 0;
    ppoVar15 = ppoVar4;
    goto switchD_00137090_default;
  }
  flagsp = t1->flags + (uVar12 + 3);
  uVar25 = (uint)(1 << ((byte)bpno & 0x1f)) >> 1 | 1 << (bpno & 0x1fU);
  puVar14 = (uint *)t1->data;
  ppoVar15 = (t1->mqc).curctx;
  uVar16 = (t1->mqc).c;
  uVar9 = (ulong)uVar16;
  uVar17 = (t1->mqc).a;
  OVar24 = (t1->mqc).ct;
  uVar27 = t1->h;
  if ((cblksty & 8U) == 0) {
    uVar20 = 0;
    if (3 < uVar27) {
      ppOVar1 = &(t1->mqc).bp;
      uVar32 = -uVar25;
      uVar18 = uVar12 * 3;
      ppoVar4 = (t1->mqc).ctxs + 0x11;
      ppoVar5 = (t1->mqc).ctxs + 0x12;
      uVar20 = 0;
      do {
        if (uVar30 != 0) {
          uVar16 = 0;
LAB_00138833:
          uVar27 = *flagsp;
          uVar13 = (ulong)uVar27;
          uVar19 = (uint)(uVar9 >> 0x10);
          if (uVar13 != 0) {
            if ((uVar27 & 0x200010) == 0) {
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar27 & 0x1ef];
              ppoVar15 = (t1->mqc).ctxs + bVar6;
              poVar7 = (t1->mqc).ctxs[bVar6];
              uVar28 = poVar7->qeval;
              uVar17 = uVar17 - uVar28;
              if (uVar19 < uVar28) {
                uVar19 = (uint)(poVar7->mps == 0);
                if (uVar28 > uVar17) {
                  uVar19 = poVar7->mps;
                }
                *ppoVar15 = (&poVar7->nmps)[uVar28 <= uVar17];
                uVar17 = uVar28;
                do {
                  iVar33 = (int)uVar9;
                  if (OVar24 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x200;
                        OVar24 = 7;
                        goto LAB_001388de;
                      }
                      iVar33 = iVar33 + 0xff00;
                      pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x100;
                    }
                    OVar24 = 8;
                  }
LAB_001388de:
                  uVar17 = uVar17 * 2;
                  uVar9 = (ulong)(uint)(iVar33 * 2);
                  OVar24 = OVar24 - 1;
                } while (uVar17 < 0x8000);
              }
              else {
                uVar9 = (ulong)((int)uVar9 + uVar28 * -0x10000);
                if ((short)uVar17 < 0) {
                  uVar19 = poVar7->mps;
                }
                else {
                  uVar19 = (uint)(poVar7->mps == 0);
                  if (uVar17 >= uVar28) {
                    uVar19 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar28];
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_00138a95;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_00138a95:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
              }
              if (uVar19 != 0) {
                uVar28 = uVar27 >> 0x10 & 0x40 | uVar27 & 0xaa | uVar27 >> 0xe & 0x10 |
                         flagsp[-1] >> 0x13 & 1 | flagsp[1] >> 0x11 & 4;
                ppoVar15 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar28];
                poVar7 = *ppoVar15;
                uVar19 = poVar7->qeval;
                uVar17 = uVar17 - uVar19;
                if ((uint)(uVar9 >> 0x10) < uVar19) {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar19 > uVar17) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar19 <= uVar17];
                  uVar17 = uVar19;
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_00138cc9;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_00138cc9:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
                else {
                  uVar9 = (ulong)((int)uVar9 + uVar19 * -0x10000);
                  if ((short)uVar17 < 0) {
                    OVar29 = poVar7->mps;
                  }
                  else {
                    OVar29 = (uint)(poVar7->mps == 0);
                    if (uVar17 >= uVar19) {
                      OVar29 = poVar7->mps;
                    }
                    *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar19];
                    do {
                      iVar33 = (int)uVar9;
                      if (OVar24 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            iVar33 = iVar33 + (uint)bVar6 * 0x200;
                            OVar24 = 7;
                            goto LAB_00138d55;
                          }
                          iVar33 = iVar33 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_00138d55:
                      uVar17 = uVar17 * 2;
                      uVar9 = (ulong)(uint)(iVar33 * 2);
                      OVar24 = OVar24 - 1;
                    } while (uVar17 < 0x8000);
                  }
                }
                uVar21 = OVar29 ^ ""[uVar28];
                uVar19 = uVar32;
                if (OVar29 == ""[uVar28]) {
                  uVar19 = uVar25;
                }
                *puVar14 = uVar19;
                *(byte *)(flagsp + -1) = (byte)flagsp[-1] | 0x20;
                *(byte *)(flagsp + 1) = (byte)flagsp[1] | 8;
                uVar13 = (ulong)(t1->w + 2);
                puVar10 = flagsp + -uVar13;
                *puVar10 = uVar21 << 0x1f | *puVar10 | 0x10000;
                pbVar3 = (byte *)((long)flagsp + uVar13 * -4 + -2);
                *pbVar3 = *pbVar3 | 2;
                *(byte *)((long)puVar10 + 5) = *(byte *)((long)puVar10 + 5) | 0x80;
                uVar13 = (ulong)(uVar21 << 0x13 | uVar27 | 0x10);
              }
            }
            if ((uVar13 & 0x1000080) == 0) {
              uVar19 = (uint)(uVar13 >> 3);
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar19 & 0x1ef];
              ppoVar15 = (t1->mqc).ctxs + bVar6;
              poVar7 = (t1->mqc).ctxs[bVar6];
              uVar27 = poVar7->qeval;
              uVar17 = uVar17 - uVar27;
              if ((uint)(uVar9 >> 0x10) < uVar27) {
                OVar29 = (uint)(poVar7->mps == 0);
                if (uVar27 > uVar17) {
                  OVar29 = poVar7->mps;
                }
                *ppoVar15 = (&poVar7->nmps)[uVar27 <= uVar17];
                uVar17 = uVar27;
                do {
                  iVar33 = (int)uVar9;
                  if (OVar24 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x200;
                        OVar24 = 7;
                        goto LAB_001390a6;
                      }
                      iVar33 = iVar33 + 0xff00;
                      pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x100;
                    }
                    OVar24 = 8;
                  }
LAB_001390a6:
                  uVar17 = uVar17 * 2;
                  uVar9 = (ulong)(uint)(iVar33 * 2);
                  OVar24 = OVar24 - 1;
                } while (uVar17 < 0x8000);
              }
              else {
                uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
                if ((short)uVar17 < 0) {
                  OVar29 = poVar7->mps;
                }
                else {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar17 >= uVar27) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar27];
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_0013912e;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_0013912e:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
              }
              if (OVar29 != 0) {
                uVar19 = (uint)(uVar13 >> 0x13) & 0x40 | uVar19 & 0xaa |
                         (uint)(uVar13 >> 0xf) & 0x10 | flagsp[-1] >> 0x16 & 1 |
                         flagsp[1] >> 0x14 & 4;
                ppoVar15 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar19];
                poVar7 = *ppoVar15;
                uVar27 = poVar7->qeval;
                uVar17 = uVar17 - uVar27;
                if ((uint)(uVar9 >> 0x10) < uVar27) {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar27 > uVar17) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar27 <= uVar17];
                  uVar17 = uVar27;
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_0013921c;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_0013921c:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
                else {
                  uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
                  if ((short)uVar17 < 0) {
                    OVar29 = poVar7->mps;
                  }
                  else {
                    OVar29 = (uint)(poVar7->mps == 0);
                    if (uVar17 >= uVar27) {
                      OVar29 = poVar7->mps;
                    }
                    *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar27];
                    do {
                      iVar33 = (int)uVar9;
                      if (OVar24 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            iVar33 = iVar33 + (uint)bVar6 * 0x200;
                            OVar24 = 7;
                            goto LAB_001392a5;
                          }
                          iVar33 = iVar33 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_001392a5:
                      uVar17 = uVar17 * 2;
                      uVar9 = (ulong)(uint)(iVar33 * 2);
                      OVar24 = OVar24 - 1;
                    } while (uVar17 < 0x8000);
                  }
                }
                bVar6 = ""[uVar19];
                uVar27 = uVar32;
                if (OVar29 == bVar6) {
                  uVar27 = uVar25;
                }
                puVar14[uVar30] = uVar27;
                *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 1;
                uVar13 = (ulong)((uint)uVar13 | (OVar29 ^ bVar6) << 0x16 | 0x80);
                *(byte *)(flagsp + 1) = (byte)flagsp[1] | 0x40;
              }
            }
            if ((uVar13 & 0x8000400) == 0) {
              uVar19 = (uint)(uVar13 >> 6);
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar19 & 0x1ef];
              ppoVar15 = (t1->mqc).ctxs + bVar6;
              poVar7 = (t1->mqc).ctxs[bVar6];
              uVar27 = poVar7->qeval;
              uVar17 = uVar17 - uVar27;
              if ((uint)(uVar9 >> 0x10) < uVar27) {
                OVar29 = (uint)(poVar7->mps == 0);
                if (uVar27 > uVar17) {
                  OVar29 = poVar7->mps;
                }
                *ppoVar15 = (&poVar7->nmps)[uVar27 <= uVar17];
                uVar17 = uVar27;
                do {
                  iVar33 = (int)uVar9;
                  if (OVar24 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x200;
                        OVar24 = 7;
                        goto LAB_001393b2;
                      }
                      iVar33 = iVar33 + 0xff00;
                      pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x100;
                    }
                    OVar24 = 8;
                  }
LAB_001393b2:
                  uVar17 = uVar17 * 2;
                  uVar9 = (ulong)(uint)(iVar33 * 2);
                  OVar24 = OVar24 - 1;
                } while (uVar17 < 0x8000);
              }
              else {
                uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
                if ((short)uVar17 < 0) {
                  OVar29 = poVar7->mps;
                }
                else {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar17 >= uVar27) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar27];
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_0013943a;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_0013943a:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
              }
              if (OVar29 != 0) {
                uVar19 = (uint)(uVar13 >> 0x16) & 0x40 | uVar19 & 0xaa |
                         (uint)(uVar13 >> 0x12) & 0x10 | flagsp[-1] >> 0x19 & 1 |
                         flagsp[1] >> 0x17 & 4;
                ppoVar15 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar19];
                poVar7 = *ppoVar15;
                uVar27 = poVar7->qeval;
                uVar17 = uVar17 - uVar27;
                if ((uint)(uVar9 >> 0x10) < uVar27) {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar27 > uVar17) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar27 <= uVar17];
                  uVar17 = uVar27;
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_00139528;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_00139528:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
                else {
                  uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
                  if ((short)uVar17 < 0) {
                    OVar29 = poVar7->mps;
                  }
                  else {
                    OVar29 = (uint)(poVar7->mps == 0);
                    if (uVar17 >= uVar27) {
                      OVar29 = poVar7->mps;
                    }
                    *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar27];
                    do {
                      iVar33 = (int)uVar9;
                      if (OVar24 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            iVar33 = iVar33 + (uint)bVar6 * 0x200;
                            OVar24 = 7;
                            goto LAB_001395b1;
                          }
                          iVar33 = iVar33 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_001395b1:
                      uVar17 = uVar17 * 2;
                      uVar9 = (ulong)(uint)(iVar33 * 2);
                      OVar24 = OVar24 - 1;
                    } while (uVar17 < 0x8000);
                  }
                }
                bVar6 = ""[uVar19];
                uVar27 = uVar32;
                if (OVar29 == bVar6) {
                  uVar27 = uVar25;
                }
                puVar14[uVar12 * 2] = uVar27;
                *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 8;
                uVar13 = (ulong)((uint)uVar13 | (OVar29 ^ bVar6) << 0x19 | 0x400);
                *(byte *)((long)flagsp + 5) = *(byte *)((long)flagsp + 5) | 2;
              }
            }
            uVar27 = (uint)uVar13;
            if ((uVar13 & 0x40002000) == 0) {
              uVar28 = (uint)(uVar13 >> 9);
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar28 & 0x1ef];
              ppoVar15 = (t1->mqc).ctxs + bVar6;
              poVar7 = (t1->mqc).ctxs[bVar6];
              uVar19 = poVar7->qeval;
              uVar17 = uVar17 - uVar19;
              if ((uint)(uVar9 >> 0x10) < uVar19) {
                OVar29 = (uint)(poVar7->mps == 0);
                if (uVar19 > uVar17) {
                  OVar29 = poVar7->mps;
                }
                *ppoVar15 = (&poVar7->nmps)[uVar19 <= uVar17];
                uVar17 = uVar19;
                do {
                  iVar33 = (int)uVar9;
                  if (OVar24 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x200;
                        OVar24 = 7;
                        goto LAB_001396be;
                      }
                      iVar33 = iVar33 + 0xff00;
                      pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x100;
                    }
                    OVar24 = 8;
                  }
LAB_001396be:
                  uVar17 = uVar17 * 2;
                  uVar9 = (ulong)(uint)(iVar33 * 2);
                  OVar24 = OVar24 - 1;
                } while (uVar17 < 0x8000);
              }
              else {
                uVar9 = (ulong)((int)uVar9 + uVar19 * -0x10000);
                if ((short)uVar17 < 0) {
                  OVar29 = poVar7->mps;
                }
                else {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar17 >= uVar19) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar19];
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_00139744;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_00139744:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
              }
              if (OVar29 != 0) {
                uVar28 = (uint)(uVar13 >> 0x19) & 0x40 | uVar28 & 0xaa |
                         (uint)(uVar13 >> 0x15) & 0x10 | flagsp[-1] >> 0x1c & 1 |
                         flagsp[1] >> 0x1a & 4;
                ppoVar15 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar28];
                poVar7 = *ppoVar15;
                uVar19 = poVar7->qeval;
                uVar17 = uVar17 - uVar19;
                if ((uint)(uVar9 >> 0x10) < uVar19) {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar19 > uVar17) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar19 <= uVar17];
                  uVar17 = uVar19;
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_00139836;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_00139836:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
                else {
                  uVar9 = (ulong)((int)uVar9 + uVar19 * -0x10000);
                  if ((short)uVar17 < 0) {
                    OVar29 = poVar7->mps;
                  }
                  else {
                    OVar29 = (uint)(poVar7->mps == 0);
                    if (uVar17 >= uVar19) {
                      OVar29 = poVar7->mps;
                    }
                    *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar19];
                    do {
                      iVar33 = (int)uVar9;
                      if (OVar24 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            iVar33 = iVar33 + (uint)bVar6 * 0x200;
                            OVar24 = 7;
                            goto LAB_001398c9;
                          }
                          iVar33 = iVar33 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_001398c9:
                      uVar17 = uVar17 * 2;
                      uVar9 = (ulong)(uint)(iVar33 * 2);
                      OVar24 = OVar24 - 1;
                    } while (uVar17 < 0x8000);
                  }
                }
                uVar21 = OVar29 ^ ""[uVar28];
                uVar19 = uVar32;
                if (OVar29 == ""[uVar28]) {
                  uVar19 = uVar25;
                }
                puVar14[uVar18] = uVar19;
                *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 0x40;
                *(byte *)((long)flagsp + 5) = *(byte *)((long)flagsp + 5) | 0x10;
                uVar13 = (ulong)(t1->w + 2);
                flagsp[uVar13] = uVar21 << 0x12 | flagsp[uVar13] | 2;
                *(byte *)(flagsp + (uVar13 - 1)) = (byte)flagsp[uVar13 - 1] | 4;
                uVar27 = uVar27 | uVar21 << 0x1c | 0x2000;
                *(byte *)(flagsp + uVar13 + 1) = (byte)flagsp[uVar13 + 1] | 1;
              }
            }
LAB_0013a3c3:
            *flagsp = uVar27 & 0xb6dfffff;
            goto LAB_0013a3cd;
          }
          poVar7 = *ppoVar4;
          uVar27 = poVar7->qeval;
          uVar17 = uVar17 - uVar27;
          if (uVar19 < uVar27) {
            OVar29 = (uint)(poVar7->mps == 0);
            if (uVar27 > uVar17) {
              OVar29 = poVar7->mps;
            }
            *ppoVar4 = (&poVar7->nmps)[uVar27 <= uVar17];
            uVar17 = uVar27;
            do {
              iVar33 = (int)uVar9;
              if (OVar24 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    iVar33 = iVar33 + (uint)bVar6 * 0x200;
                    OVar24 = 7;
                    goto LAB_0013896f;
                  }
                  iVar33 = iVar33 + 0xff00;
                  pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  iVar33 = iVar33 + (uint)bVar6 * 0x100;
                }
                OVar24 = 8;
              }
LAB_0013896f:
              uVar17 = uVar17 * 2;
              uVar9 = (ulong)(uint)(iVar33 * 2);
              OVar24 = OVar24 - 1;
            } while (uVar17 < 0x8000);
          }
          else {
            uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
            if ((short)uVar17 < 0) {
              OVar29 = poVar7->mps;
            }
            else {
              OVar29 = (uint)(poVar7->mps == 0);
              if (uVar17 >= uVar27) {
                OVar29 = poVar7->mps;
              }
              *ppoVar4 = (&poVar7->nmps)[uVar17 < uVar27];
              do {
                iVar33 = (int)uVar9;
                if (OVar24 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x200;
                      OVar24 = 7;
                      goto LAB_001389fe;
                    }
                    iVar33 = iVar33 + 0xff00;
                    pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    iVar33 = iVar33 + (uint)bVar6 * 0x100;
                  }
                  OVar24 = 8;
                }
LAB_001389fe:
                uVar17 = uVar17 * 2;
                uVar9 = (ulong)(uint)(iVar33 * 2);
                OVar24 = OVar24 - 1;
              } while (uVar17 < 0x8000);
            }
          }
          if (OVar29 != 0) {
            poVar7 = *ppoVar5;
            uVar27 = poVar7->qeval;
            uVar17 = uVar17 - uVar27;
            if ((uint)(uVar9 >> 0x10) < uVar27) {
              uVar19 = (uint)(poVar7->mps == 0);
              if (uVar27 > uVar17) {
                uVar19 = poVar7->mps;
              }
              *ppoVar5 = (&poVar7->nmps)[uVar27 <= uVar17];
              do {
                iVar33 = (int)uVar9;
                if (OVar24 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x200;
                      OVar24 = 7;
                      goto LAB_00138b3e;
                    }
                    iVar33 = iVar33 + 0xff00;
                    pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    iVar33 = iVar33 + (uint)bVar6 * 0x100;
                  }
                  OVar24 = 8;
                }
LAB_00138b3e:
                uVar27 = uVar27 * 2;
                uVar9 = (ulong)(uint)(iVar33 * 2);
                OVar24 = OVar24 - 1;
              } while (uVar27 < 0x8000);
            }
            else {
              uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
              if ((short)uVar17 < 0) {
                uVar19 = poVar7->mps;
                uVar27 = uVar17;
              }
              else {
                uVar19 = (uint)(poVar7->mps == 0);
                if (uVar17 >= uVar27) {
                  uVar19 = poVar7->mps;
                }
                *ppoVar5 = (&poVar7->nmps)[uVar17 < uVar27];
                uVar27 = uVar17;
                do {
                  iVar33 = (int)uVar9;
                  if (OVar24 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x200;
                        OVar24 = 7;
                        goto LAB_00138bd4;
                      }
                      iVar33 = iVar33 + 0xff00;
                      pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x100;
                    }
                    OVar24 = 8;
                  }
LAB_00138bd4:
                  uVar27 = uVar27 * 2;
                  uVar9 = (ulong)(uint)(iVar33 * 2);
                  OVar24 = OVar24 - 1;
                } while (uVar27 < 0x8000);
              }
            }
            poVar7 = *ppoVar5;
            uVar28 = poVar7->qeval;
            uVar17 = uVar27 - uVar28;
            if ((uint)(uVar9 >> 0x10) < uVar28) {
              OVar26 = (uint)(poVar7->mps == 0);
              if (uVar28 > uVar17) {
                OVar26 = poVar7->mps;
              }
              *ppoVar5 = (&poVar7->nmps)[uVar28 <= uVar17];
              uVar17 = uVar28;
              do {
                iVar33 = (int)uVar9;
                if (OVar24 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x200;
                      OVar24 = 7;
                      goto LAB_00138def;
                    }
                    iVar33 = iVar33 + 0xff00;
                    pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    iVar33 = iVar33 + (uint)bVar6 * 0x100;
                  }
                  OVar24 = 8;
                }
LAB_00138def:
                uVar17 = uVar17 * 2;
                uVar9 = (ulong)(uint)(iVar33 * 2);
                OVar24 = OVar24 - 1;
              } while (uVar17 < 0x8000);
            }
            else {
              uVar9 = (ulong)((int)uVar9 + uVar28 * -0x10000);
              if ((short)uVar17 < 0) {
                OVar26 = poVar7->mps;
              }
              else {
                OVar26 = (uint)(poVar7->mps == 0);
                if (uVar17 >= uVar28) {
                  OVar26 = poVar7->mps;
                }
                *ppoVar5 = (&poVar7->nmps)[uVar17 < uVar28];
                do {
                  iVar33 = (int)uVar9;
                  if (OVar24 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x200;
                        OVar24 = 7;
                        goto LAB_00138e76;
                      }
                      iVar33 = iVar33 + 0xff00;
                      pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x100;
                    }
                    OVar24 = 8;
                  }
LAB_00138e76:
                  uVar17 = uVar17 * 2;
                  uVar9 = (ulong)(uint)(iVar33 * 2);
                  OVar24 = OVar24 - 1;
                } while (uVar17 < 0x8000);
              }
            }
            uVar19 = uVar19 * 2 | OVar26;
            uVar13 = 0;
            uVar27 = 0;
            ppoVar15 = ppoVar5;
            switch(uVar19) {
            case 0:
              goto switchD_00138ebf_caseD_0;
            case 1:
              goto switchD_00138ebf_caseD_1;
            case 2:
              bVar34 = false;
              goto LAB_00139d7d;
            case 3:
              bVar34 = false;
              goto LAB_0013a086;
            default:
              goto switchD_00138ebf_default;
            }
          }
          uVar27 = 0;
          ppoVar15 = ppoVar4;
          goto switchD_00138ebf_default;
        }
LAB_0013a3ea:
        uVar16 = (uint)uVar9;
        uVar20 = uVar20 + 4;
        puVar14 = puVar14 + uVar18;
        flagsp = flagsp + 2;
        uVar27 = t1->h;
      } while (uVar20 < (uVar27 & 0xfffffffc));
    }
    (t1->mqc).curctx = ppoVar15;
    (t1->mqc).c = uVar16;
    (t1->mqc).a = uVar17;
    (t1->mqc).ct = OVar24;
    if (uVar30 != 0 && uVar20 < uVar27) {
      uVar16 = 0;
      do {
        if (t1->h != uVar20) {
          uVar17 = 0;
          uVar30 = 0;
          do {
            opj_t1_dec_clnpass_step
                      (t1,flagsp,(OPJ_INT32 *)(puVar14 + uVar17),uVar25,(OPJ_UINT32)uVar30,0);
            uVar30 = uVar30 + 1;
            uVar17 = uVar17 + uVar12;
          } while (uVar30 < t1->h - uVar20);
        }
        *flagsp = *flagsp & 0xb6dfffff;
        uVar16 = uVar16 + 1;
        flagsp = flagsp + 1;
        puVar14 = puVar14 + 1;
      } while (uVar16 != uVar12);
    }
  }
  else {
    uVar20 = 0;
    if (3 < uVar27) {
      ppOVar1 = &(t1->mqc).bp;
      uVar32 = -uVar25;
      uVar18 = uVar12 * 3;
      ppoVar4 = (t1->mqc).ctxs + 0x11;
      ppoVar5 = (t1->mqc).ctxs + 0x12;
      uVar20 = 0;
      do {
        if (uVar30 != 0) {
          uVar16 = 0;
LAB_0013a538:
          uVar27 = *flagsp;
          uVar13 = (ulong)uVar27;
          uVar19 = (uint)(uVar9 >> 0x10);
          if (uVar13 != 0) {
            if ((uVar27 & 0x200010) == 0) {
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar27 & 0x1ef];
              ppoVar15 = (t1->mqc).ctxs + bVar6;
              poVar7 = (t1->mqc).ctxs[bVar6];
              uVar28 = poVar7->qeval;
              uVar17 = uVar17 - uVar28;
              if (uVar19 < uVar28) {
                uVar19 = (uint)(poVar7->mps == 0);
                if (uVar28 > uVar17) {
                  uVar19 = poVar7->mps;
                }
                *ppoVar15 = (&poVar7->nmps)[uVar28 <= uVar17];
                uVar17 = uVar28;
                do {
                  iVar33 = (int)uVar9;
                  if (OVar24 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x200;
                        OVar24 = 7;
                        goto LAB_0013a5e3;
                      }
                      iVar33 = iVar33 + 0xff00;
                      pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x100;
                    }
                    OVar24 = 8;
                  }
LAB_0013a5e3:
                  uVar17 = uVar17 * 2;
                  uVar9 = (ulong)(uint)(iVar33 * 2);
                  OVar24 = OVar24 - 1;
                } while (uVar17 < 0x8000);
              }
              else {
                uVar9 = (ulong)((int)uVar9 + uVar28 * -0x10000);
                if ((short)uVar17 < 0) {
                  uVar19 = poVar7->mps;
                }
                else {
                  uVar19 = (uint)(poVar7->mps == 0);
                  if (uVar17 >= uVar28) {
                    uVar19 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar28];
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_0013a78e;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_0013a78e:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
              }
              if (uVar19 != 0) {
                uVar28 = uVar27 >> 0x10 & 0x40 | uVar27 & 0xaa | uVar27 >> 0xe & 0x10 |
                         flagsp[-1] >> 0x13 & 1 | flagsp[1] >> 0x11 & 4;
                ppoVar15 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar28];
                poVar7 = *ppoVar15;
                uVar19 = poVar7->qeval;
                uVar17 = uVar17 - uVar19;
                if ((uint)(uVar9 >> 0x10) < uVar19) {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar19 > uVar17) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar19 <= uVar17];
                  uVar17 = uVar19;
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_0013a9c2;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_0013a9c2:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
                else {
                  uVar9 = (ulong)((int)uVar9 + uVar19 * -0x10000);
                  if ((short)uVar17 < 0) {
                    OVar29 = poVar7->mps;
                  }
                  else {
                    OVar29 = (uint)(poVar7->mps == 0);
                    if (uVar17 >= uVar19) {
                      OVar29 = poVar7->mps;
                    }
                    *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar19];
                    do {
                      iVar33 = (int)uVar9;
                      if (OVar24 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            iVar33 = iVar33 + (uint)bVar6 * 0x200;
                            OVar24 = 7;
                            goto LAB_0013aa4e;
                          }
                          iVar33 = iVar33 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_0013aa4e:
                      uVar17 = uVar17 * 2;
                      uVar9 = (ulong)(uint)(iVar33 * 2);
                      OVar24 = OVar24 - 1;
                    } while (uVar17 < 0x8000);
                  }
                }
                bVar6 = ""[uVar28];
                uVar19 = uVar32;
                if (OVar29 == bVar6) {
                  uVar19 = uVar25;
                }
                *puVar14 = uVar19;
                *(byte *)(flagsp + -1) = (byte)flagsp[-1] | 0x20;
                *(byte *)(flagsp + 1) = (byte)flagsp[1] | 8;
                uVar13 = (ulong)((OVar29 ^ bVar6) << 0x13 | uVar27 | 0x10);
              }
            }
            if ((uVar13 & 0x1000080) == 0) {
              uVar19 = (uint)(uVar13 >> 3);
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar19 & 0x1ef];
              ppoVar15 = (t1->mqc).ctxs + bVar6;
              poVar7 = (t1->mqc).ctxs[bVar6];
              uVar27 = poVar7->qeval;
              uVar17 = uVar17 - uVar27;
              if ((uint)(uVar9 >> 0x10) < uVar27) {
                OVar29 = (uint)(poVar7->mps == 0);
                if (uVar27 > uVar17) {
                  OVar29 = poVar7->mps;
                }
                *ppoVar15 = (&poVar7->nmps)[uVar27 <= uVar17];
                uVar17 = uVar27;
                do {
                  iVar33 = (int)uVar9;
                  if (OVar24 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x200;
                        OVar24 = 7;
                        goto LAB_0013ad88;
                      }
                      iVar33 = iVar33 + 0xff00;
                      pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x100;
                    }
                    OVar24 = 8;
                  }
LAB_0013ad88:
                  uVar17 = uVar17 * 2;
                  uVar9 = (ulong)(uint)(iVar33 * 2);
                  OVar24 = OVar24 - 1;
                } while (uVar17 < 0x8000);
              }
              else {
                uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
                if ((short)uVar17 < 0) {
                  OVar29 = poVar7->mps;
                }
                else {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar17 >= uVar27) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar27];
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_0013ae10;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_0013ae10:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
              }
              if (OVar29 != 0) {
                uVar19 = (uint)(uVar13 >> 0x13) & 0x40 | uVar19 & 0xaa |
                         (uint)(uVar13 >> 0xf) & 0x10 | flagsp[-1] >> 0x16 & 1 |
                         flagsp[1] >> 0x14 & 4;
                ppoVar15 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar19];
                poVar7 = *ppoVar15;
                uVar27 = poVar7->qeval;
                uVar17 = uVar17 - uVar27;
                if ((uint)(uVar9 >> 0x10) < uVar27) {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar27 > uVar17) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar27 <= uVar17];
                  uVar17 = uVar27;
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_0013aefe;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_0013aefe:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
                else {
                  uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
                  if ((short)uVar17 < 0) {
                    OVar29 = poVar7->mps;
                  }
                  else {
                    OVar29 = (uint)(poVar7->mps == 0);
                    if (uVar17 >= uVar27) {
                      OVar29 = poVar7->mps;
                    }
                    *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar27];
                    do {
                      iVar33 = (int)uVar9;
                      if (OVar24 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            iVar33 = iVar33 + (uint)bVar6 * 0x200;
                            OVar24 = 7;
                            goto LAB_0013af87;
                          }
                          iVar33 = iVar33 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_0013af87:
                      uVar17 = uVar17 * 2;
                      uVar9 = (ulong)(uint)(iVar33 * 2);
                      OVar24 = OVar24 - 1;
                    } while (uVar17 < 0x8000);
                  }
                }
                bVar6 = ""[uVar19];
                uVar27 = uVar32;
                if (OVar29 == bVar6) {
                  uVar27 = uVar25;
                }
                puVar14[uVar30] = uVar27;
                *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 1;
                uVar13 = (ulong)((uint)uVar13 | (OVar29 ^ bVar6) << 0x16 | 0x80);
                *(byte *)(flagsp + 1) = (byte)flagsp[1] | 0x40;
              }
            }
            if ((uVar13 & 0x8000400) == 0) {
              uVar19 = (uint)(uVar13 >> 6);
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar19 & 0x1ef];
              ppoVar15 = (t1->mqc).ctxs + bVar6;
              poVar7 = (t1->mqc).ctxs[bVar6];
              uVar27 = poVar7->qeval;
              uVar17 = uVar17 - uVar27;
              if ((uint)(uVar9 >> 0x10) < uVar27) {
                OVar29 = (uint)(poVar7->mps == 0);
                if (uVar27 > uVar17) {
                  OVar29 = poVar7->mps;
                }
                *ppoVar15 = (&poVar7->nmps)[uVar27 <= uVar17];
                uVar17 = uVar27;
                do {
                  iVar33 = (int)uVar9;
                  if (OVar24 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x200;
                        OVar24 = 7;
                        goto LAB_0013b093;
                      }
                      iVar33 = iVar33 + 0xff00;
                      pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x100;
                    }
                    OVar24 = 8;
                  }
LAB_0013b093:
                  uVar17 = uVar17 * 2;
                  uVar9 = (ulong)(uint)(iVar33 * 2);
                  OVar24 = OVar24 - 1;
                } while (uVar17 < 0x8000);
              }
              else {
                uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
                if ((short)uVar17 < 0) {
                  OVar29 = poVar7->mps;
                }
                else {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar17 >= uVar27) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar27];
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_0013b11b;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_0013b11b:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
              }
              if (OVar29 != 0) {
                uVar19 = (uint)(uVar13 >> 0x16) & 0x40 | uVar19 & 0xaa |
                         (uint)(uVar13 >> 0x12) & 0x10 | flagsp[-1] >> 0x19 & 1 |
                         flagsp[1] >> 0x17 & 4;
                ppoVar15 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar19];
                poVar7 = *ppoVar15;
                uVar27 = poVar7->qeval;
                uVar17 = uVar17 - uVar27;
                if ((uint)(uVar9 >> 0x10) < uVar27) {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar27 > uVar17) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar27 <= uVar17];
                  uVar17 = uVar27;
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_0013b209;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_0013b209:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
                else {
                  uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
                  if ((short)uVar17 < 0) {
                    OVar29 = poVar7->mps;
                  }
                  else {
                    OVar29 = (uint)(poVar7->mps == 0);
                    if (uVar17 >= uVar27) {
                      OVar29 = poVar7->mps;
                    }
                    *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar27];
                    do {
                      iVar33 = (int)uVar9;
                      if (OVar24 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            iVar33 = iVar33 + (uint)bVar6 * 0x200;
                            OVar24 = 7;
                            goto LAB_0013b292;
                          }
                          iVar33 = iVar33 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_0013b292:
                      uVar17 = uVar17 * 2;
                      uVar9 = (ulong)(uint)(iVar33 * 2);
                      OVar24 = OVar24 - 1;
                    } while (uVar17 < 0x8000);
                  }
                }
                bVar6 = ""[uVar19];
                uVar27 = uVar32;
                if (OVar29 == bVar6) {
                  uVar27 = uVar25;
                }
                puVar14[uVar12 * 2] = uVar27;
                *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 8;
                uVar13 = (ulong)((uint)uVar13 | (OVar29 ^ bVar6) << 0x19 | 0x400);
                *(byte *)((long)flagsp + 5) = *(byte *)((long)flagsp + 5) | 2;
              }
            }
            uVar27 = (uint)uVar13;
            if ((uVar13 & 0x40002000) == 0) {
              uVar28 = (uint)(uVar13 >> 9);
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar28 & 0x1ef];
              ppoVar15 = (t1->mqc).ctxs + bVar6;
              poVar7 = (t1->mqc).ctxs[bVar6];
              uVar19 = poVar7->qeval;
              uVar17 = uVar17 - uVar19;
              if ((uint)(uVar9 >> 0x10) < uVar19) {
                OVar29 = (uint)(poVar7->mps == 0);
                if (uVar19 > uVar17) {
                  OVar29 = poVar7->mps;
                }
                *ppoVar15 = (&poVar7->nmps)[uVar19 <= uVar17];
                uVar17 = uVar19;
                do {
                  iVar33 = (int)uVar9;
                  if (OVar24 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x200;
                        OVar24 = 7;
                        goto LAB_0013b39e;
                      }
                      iVar33 = iVar33 + 0xff00;
                      pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x100;
                    }
                    OVar24 = 8;
                  }
LAB_0013b39e:
                  uVar17 = uVar17 * 2;
                  uVar9 = (ulong)(uint)(iVar33 * 2);
                  OVar24 = OVar24 - 1;
                } while (uVar17 < 0x8000);
              }
              else {
                uVar9 = (ulong)((int)uVar9 + uVar19 * -0x10000);
                if ((short)uVar17 < 0) {
                  OVar29 = poVar7->mps;
                }
                else {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar17 >= uVar19) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar19];
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_0013b424;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_0013b424:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
              }
              if (OVar29 != 0) {
                uVar28 = (uint)(uVar13 >> 0x19) & 0x40 | uVar28 & 0xaa |
                         (uint)(uVar13 >> 0x15) & 0x10 | flagsp[-1] >> 0x1c & 1 |
                         flagsp[1] >> 0x1a & 4;
                ppoVar15 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar28];
                poVar7 = *ppoVar15;
                uVar19 = poVar7->qeval;
                uVar17 = uVar17 - uVar19;
                if ((uint)(uVar9 >> 0x10) < uVar19) {
                  OVar29 = (uint)(poVar7->mps == 0);
                  if (uVar19 > uVar17) {
                    OVar29 = poVar7->mps;
                  }
                  *ppoVar15 = (&poVar7->nmps)[uVar19 <= uVar17];
                  uVar17 = uVar19;
                  do {
                    iVar33 = (int)uVar9;
                    if (OVar24 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x200;
                          OVar24 = 7;
                          goto LAB_0013b516;
                        }
                        iVar33 = iVar33 + 0xff00;
                        pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar2 = *pOVar2 + 1;
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x100;
                      }
                      OVar24 = 8;
                    }
LAB_0013b516:
                    uVar17 = uVar17 * 2;
                    uVar9 = (ulong)(uint)(iVar33 * 2);
                    OVar24 = OVar24 - 1;
                  } while (uVar17 < 0x8000);
                }
                else {
                  uVar9 = (ulong)((int)uVar9 + uVar19 * -0x10000);
                  if ((short)uVar17 < 0) {
                    OVar29 = poVar7->mps;
                  }
                  else {
                    OVar29 = (uint)(poVar7->mps == 0);
                    if (uVar17 >= uVar19) {
                      OVar29 = poVar7->mps;
                    }
                    *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar19];
                    do {
                      iVar33 = (int)uVar9;
                      if (OVar24 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            iVar33 = iVar33 + (uint)bVar6 * 0x200;
                            OVar24 = 7;
                            goto LAB_0013b5a9;
                          }
                          iVar33 = iVar33 + 0xff00;
                          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar2 = *pOVar2 + 1;
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          iVar33 = iVar33 + (uint)bVar6 * 0x100;
                        }
                        OVar24 = 8;
                      }
LAB_0013b5a9:
                      uVar17 = uVar17 * 2;
                      uVar9 = (ulong)(uint)(iVar33 * 2);
                      OVar24 = OVar24 - 1;
                    } while (uVar17 < 0x8000);
                  }
                }
                uVar21 = OVar29 ^ ""[uVar28];
                uVar19 = uVar32;
                if (OVar29 == ""[uVar28]) {
                  uVar19 = uVar25;
                }
                puVar14[uVar18] = uVar19;
                *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 0x40;
                *(byte *)((long)flagsp + 5) = *(byte *)((long)flagsp + 5) | 0x10;
                uVar13 = (ulong)(t1->w + 2);
                flagsp[uVar13] = uVar21 << 0x12 | flagsp[uVar13] | 2;
                *(byte *)(flagsp + (uVar13 - 1)) = (byte)flagsp[uVar13 - 1] | 4;
                uVar27 = uVar27 | uVar21 << 0x1c | 0x2000;
                *(byte *)(flagsp + uVar13 + 1) = (byte)flagsp[uVar13 + 1] | 1;
              }
            }
LAB_0013c0da:
            *flagsp = uVar27 & 0xb6dfffff;
            goto LAB_0013c0e4;
          }
          poVar7 = *ppoVar4;
          uVar27 = poVar7->qeval;
          uVar17 = uVar17 - uVar27;
          if (uVar19 < uVar27) {
            uVar19 = (uint)(poVar7->mps == 0);
            if (uVar27 > uVar17) {
              uVar19 = poVar7->mps;
            }
            *ppoVar4 = (&poVar7->nmps)[uVar27 <= uVar17];
            uVar17 = uVar27;
            do {
              iVar33 = (int)uVar9;
              if (OVar24 == 0) {
                pOVar8 = *ppOVar1;
                bVar6 = pOVar8[1];
                if (*pOVar8 == 0xff) {
                  if (bVar6 < 0x90) {
                    *ppOVar1 = pOVar8 + 1;
                    iVar33 = iVar33 + (uint)bVar6 * 0x200;
                    OVar24 = 7;
                    goto LAB_0013a671;
                  }
                  iVar33 = iVar33 + 0xff00;
                  pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                  *pOVar2 = *pOVar2 + 1;
                }
                else {
                  *ppOVar1 = pOVar8 + 1;
                  iVar33 = iVar33 + (uint)bVar6 * 0x100;
                }
                OVar24 = 8;
              }
LAB_0013a671:
              uVar17 = uVar17 * 2;
              uVar9 = (ulong)(uint)(iVar33 * 2);
              OVar24 = OVar24 - 1;
            } while (uVar17 < 0x8000);
          }
          else {
            uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
            if ((short)uVar17 < 0) {
              uVar19 = poVar7->mps;
            }
            else {
              uVar19 = (uint)(poVar7->mps == 0);
              if (uVar17 >= uVar27) {
                uVar19 = poVar7->mps;
              }
              *ppoVar4 = (&poVar7->nmps)[uVar17 < uVar27];
              do {
                iVar33 = (int)uVar9;
                if (OVar24 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x200;
                      OVar24 = 7;
                      goto LAB_0013a6fa;
                    }
                    iVar33 = iVar33 + 0xff00;
                    pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    iVar33 = iVar33 + (uint)bVar6 * 0x100;
                  }
                  OVar24 = 8;
                }
LAB_0013a6fa:
                uVar17 = uVar17 * 2;
                uVar9 = (ulong)(uint)(iVar33 * 2);
                OVar24 = OVar24 - 1;
              } while (uVar17 < 0x8000);
            }
          }
          if (uVar19 != 0) {
            poVar7 = *ppoVar5;
            uVar27 = poVar7->qeval;
            uVar17 = uVar17 - uVar27;
            if ((uint)(uVar9 >> 0x10) < uVar27) {
              uVar28 = (uint)(poVar7->mps == 0);
              if (uVar27 > uVar17) {
                uVar28 = poVar7->mps;
              }
              *ppoVar5 = (&poVar7->nmps)[uVar27 <= uVar17];
              do {
                iVar33 = (int)uVar9;
                if (OVar24 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x200;
                      OVar24 = 7;
                      goto LAB_0013a835;
                    }
                    iVar33 = iVar33 + 0xff00;
                    pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    iVar33 = iVar33 + (uint)bVar6 * 0x100;
                  }
                  OVar24 = 8;
                }
LAB_0013a835:
                uVar27 = uVar27 * 2;
                uVar9 = (ulong)(uint)(iVar33 * 2);
                OVar24 = OVar24 - 1;
              } while (uVar27 < 0x8000);
            }
            else {
              uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
              if ((short)uVar17 < 0) {
                uVar28 = poVar7->mps;
                uVar27 = uVar17;
              }
              else {
                uVar28 = (uint)(poVar7->mps == 0);
                if (uVar17 >= uVar27) {
                  uVar28 = poVar7->mps;
                }
                *ppoVar5 = (&poVar7->nmps)[uVar17 < uVar27];
                uVar27 = uVar17;
                do {
                  iVar33 = (int)uVar9;
                  if (OVar24 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x200;
                        OVar24 = 7;
                        goto LAB_0013a8cd;
                      }
                      iVar33 = iVar33 + 0xff00;
                      pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x100;
                    }
                    OVar24 = 8;
                  }
LAB_0013a8cd:
                  uVar27 = uVar27 * 2;
                  uVar9 = (ulong)(uint)(iVar33 * 2);
                  OVar24 = OVar24 - 1;
                } while (uVar27 < 0x8000);
              }
            }
            poVar7 = *ppoVar5;
            uVar21 = poVar7->qeval;
            uVar17 = uVar27 - uVar21;
            if ((uint)(uVar9 >> 0x10) < uVar21) {
              OVar29 = (uint)(poVar7->mps == 0);
              if (uVar21 > uVar17) {
                OVar29 = poVar7->mps;
              }
              *ppoVar5 = (&poVar7->nmps)[uVar21 <= uVar17];
              uVar17 = uVar21;
              do {
                iVar33 = (int)uVar9;
                if (OVar24 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x200;
                      OVar24 = 7;
                      goto LAB_0013aaef;
                    }
                    iVar33 = iVar33 + 0xff00;
                    pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                    *pOVar2 = *pOVar2 + 1;
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    iVar33 = iVar33 + (uint)bVar6 * 0x100;
                  }
                  OVar24 = 8;
                }
LAB_0013aaef:
                uVar17 = uVar17 * 2;
                uVar9 = (ulong)(uint)(iVar33 * 2);
                OVar24 = OVar24 - 1;
              } while (uVar17 < 0x8000);
            }
            else {
              uVar9 = (ulong)((int)uVar9 + uVar21 * -0x10000);
              if ((short)uVar17 < 0) {
                OVar29 = poVar7->mps;
              }
              else {
                OVar29 = (uint)(poVar7->mps == 0);
                if (uVar17 >= uVar21) {
                  OVar29 = poVar7->mps;
                }
                *ppoVar5 = (&poVar7->nmps)[uVar17 < uVar21];
                do {
                  iVar33 = (int)uVar9;
                  if (OVar24 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        iVar33 = iVar33 + (uint)bVar6 * 0x200;
                        OVar24 = 7;
                        goto LAB_0013ab83;
                      }
                      iVar33 = iVar33 + 0xff00;
                      pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar2 = *pOVar2 + 1;
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      iVar33 = iVar33 + (uint)bVar6 * 0x100;
                    }
                    OVar24 = 8;
                  }
LAB_0013ab83:
                  uVar17 = uVar17 * 2;
                  uVar9 = (ulong)(uint)(iVar33 * 2);
                  OVar24 = OVar24 - 1;
                } while (uVar17 < 0x8000);
              }
            }
            uVar28 = uVar28 * 2 | OVar29;
            uVar13 = 0;
            uVar27 = 0;
            ppoVar15 = ppoVar5;
            switch(uVar28) {
            case 0:
              goto switchD_0013abd0_caseD_0;
            case 1:
              goto switchD_0013abd0_caseD_1;
            case 2:
              bVar34 = false;
              goto LAB_0013ba56;
            case 3:
              bVar34 = false;
              goto LAB_0013bd87;
            default:
              goto switchD_0013abd0_default;
            }
          }
          uVar27 = 0;
          ppoVar15 = ppoVar4;
          goto switchD_0013abd0_default;
        }
LAB_0013c10b:
        uVar16 = (uint)uVar9;
        uVar20 = uVar20 + 4;
        puVar14 = puVar14 + uVar18;
        flagsp = flagsp + 2;
        uVar27 = t1->h;
      } while (uVar20 < (uVar27 & 0xfffffffc));
    }
    (t1->mqc).curctx = ppoVar15;
    (t1->mqc).c = uVar16;
    (t1->mqc).a = uVar17;
    (t1->mqc).ct = OVar24;
    if (uVar30 != 0 && uVar20 < uVar27) {
      uVar16 = 0;
      do {
        if (t1->h != uVar20) {
          uVar17 = 0;
          uVar30 = 0;
          do {
            opj_t1_dec_clnpass_step
                      (t1,flagsp,(OPJ_INT32 *)(puVar14 + uVar17),uVar25,(OPJ_UINT32)uVar30,1);
            uVar30 = uVar30 + 1;
            uVar17 = uVar17 + uVar12;
          } while (uVar30 < t1->h - uVar20);
        }
        *flagsp = *flagsp & 0xb6dfffff;
        uVar16 = uVar16 + 1;
        flagsp = flagsp + 1;
        puVar14 = puVar14 + 1;
      } while (uVar16 != uVar12);
    }
  }
LAB_0013e041:
  if ((cblksty & 0x20U) != 0) {
    (t1->mqc).curctx = (t1->mqc).ctxs + 0x12;
    poVar7 = (t1->mqc).ctxs[0x12];
    uVar12 = poVar7->qeval;
    uVar16 = (t1->mqc).c;
    uVar17 = (t1->mqc).a - uVar12;
    (t1->mqc).a = uVar17;
    if (uVar16 >> 0x10 < uVar12) {
      (t1->mqc).a = uVar12;
      (t1->mqc).ctxs[0x12] = (&poVar7->nmps)[uVar12 <= uVar17];
      OVar24 = (t1->mqc).ct;
      do {
        if (OVar24 == 0) {
          pOVar8 = (t1->mqc).bp;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              (t1->mqc).bp = pOVar8 + 1;
              uVar16 = uVar16 + (uint)bVar6 * 0x200;
              (t1->mqc).c = uVar16;
              (t1->mqc).ct = 7;
              OVar24 = 7;
              goto LAB_0013e0fd;
            }
            uVar16 = uVar16 + 0xff00;
            (t1->mqc).c = uVar16;
            (t1->mqc).ct = 8;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            (t1->mqc).bp = pOVar8 + 1;
            uVar16 = uVar16 + (uint)bVar6 * 0x100;
            (t1->mqc).c = uVar16;
            (t1->mqc).ct = 8;
          }
          OVar24 = 8;
        }
LAB_0013e0fd:
        uVar12 = uVar12 * 2;
        (t1->mqc).a = uVar12;
        uVar16 = uVar16 * 2;
        (t1->mqc).c = uVar16;
        OVar24 = OVar24 - 1;
        (t1->mqc).ct = OVar24;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = uVar16 + uVar12 * -0x10000;
      (t1->mqc).c = OVar24;
      if (-1 < (short)uVar17) {
        (t1->mqc).ctxs[0x12] = (&poVar7->nmps)[uVar17 < uVar12];
        OVar29 = (t1->mqc).ct;
        do {
          if (OVar29 == 0) {
            pOVar8 = (t1->mqc).bp;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                (t1->mqc).bp = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                (t1->mqc).c = OVar24;
                (t1->mqc).ct = 7;
                OVar29 = 7;
                goto LAB_0013e1ba;
              }
              OVar24 = OVar24 + 0xff00;
              (t1->mqc).c = OVar24;
              (t1->mqc).ct = 8;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              (t1->mqc).bp = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
              (t1->mqc).c = OVar24;
              (t1->mqc).ct = 8;
            }
            OVar29 = 8;
          }
LAB_0013e1ba:
          uVar17 = uVar17 * 2;
          (t1->mqc).a = uVar17;
          OVar24 = OVar24 * 2;
          (t1->mqc).c = OVar24;
          OVar29 = OVar29 - 1;
          (t1->mqc).ct = OVar29;
        } while (uVar17 < 0x8000);
      }
    }
    poVar7 = (t1->mqc).ctxs[0x12];
    uVar12 = poVar7->qeval;
    uVar16 = (t1->mqc).c;
    uVar17 = (t1->mqc).a - uVar12;
    (t1->mqc).a = uVar17;
    if (uVar16 >> 0x10 < uVar12) {
      (t1->mqc).a = uVar12;
      (t1->mqc).ctxs[0x12] = (&poVar7->nmps)[uVar12 <= uVar17];
      OVar24 = (t1->mqc).ct;
      do {
        if (OVar24 == 0) {
          pOVar8 = (t1->mqc).bp;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              (t1->mqc).bp = pOVar8 + 1;
              uVar16 = uVar16 + (uint)bVar6 * 0x200;
              (t1->mqc).c = uVar16;
              (t1->mqc).ct = 7;
              OVar24 = 7;
              goto LAB_0013e28c;
            }
            uVar16 = uVar16 + 0xff00;
            (t1->mqc).c = uVar16;
            (t1->mqc).ct = 8;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            (t1->mqc).bp = pOVar8 + 1;
            uVar16 = uVar16 + (uint)bVar6 * 0x100;
            (t1->mqc).c = uVar16;
            (t1->mqc).ct = 8;
          }
          OVar24 = 8;
        }
LAB_0013e28c:
        uVar12 = uVar12 * 2;
        (t1->mqc).a = uVar12;
        uVar16 = uVar16 * 2;
        (t1->mqc).c = uVar16;
        OVar24 = OVar24 - 1;
        (t1->mqc).ct = OVar24;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = uVar16 + uVar12 * -0x10000;
      (t1->mqc).c = OVar24;
      if (-1 < (short)uVar17) {
        (t1->mqc).ctxs[0x12] = (&poVar7->nmps)[uVar17 < uVar12];
        OVar29 = (t1->mqc).ct;
        do {
          if (OVar29 == 0) {
            pOVar8 = (t1->mqc).bp;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                (t1->mqc).bp = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                (t1->mqc).c = OVar24;
                (t1->mqc).ct = 7;
                OVar29 = 7;
                goto LAB_0013e349;
              }
              OVar24 = OVar24 + 0xff00;
              (t1->mqc).c = OVar24;
              (t1->mqc).ct = 8;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              (t1->mqc).bp = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
              (t1->mqc).c = OVar24;
              (t1->mqc).ct = 8;
            }
            OVar29 = 8;
          }
LAB_0013e349:
          uVar17 = uVar17 * 2;
          (t1->mqc).a = uVar17;
          OVar24 = OVar24 * 2;
          (t1->mqc).c = OVar24;
          OVar29 = OVar29 - 1;
          (t1->mqc).ct = OVar29;
        } while (uVar17 < 0x8000);
      }
    }
    poVar7 = (t1->mqc).ctxs[0x12];
    uVar12 = poVar7->qeval;
    uVar16 = (t1->mqc).c;
    uVar17 = (t1->mqc).a - uVar12;
    (t1->mqc).a = uVar17;
    if (uVar16 >> 0x10 < uVar12) {
      (t1->mqc).a = uVar12;
      (t1->mqc).ctxs[0x12] = (&poVar7->nmps)[uVar12 <= uVar17];
      OVar24 = (t1->mqc).ct;
      do {
        if (OVar24 == 0) {
          pOVar8 = (t1->mqc).bp;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              (t1->mqc).bp = pOVar8 + 1;
              uVar16 = uVar16 + (uint)bVar6 * 0x200;
              (t1->mqc).c = uVar16;
              (t1->mqc).ct = 7;
              OVar24 = 7;
              goto LAB_0013e41b;
            }
            uVar16 = uVar16 + 0xff00;
            (t1->mqc).c = uVar16;
            (t1->mqc).ct = 8;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            (t1->mqc).bp = pOVar8 + 1;
            uVar16 = uVar16 + (uint)bVar6 * 0x100;
            (t1->mqc).c = uVar16;
            (t1->mqc).ct = 8;
          }
          OVar24 = 8;
        }
LAB_0013e41b:
        uVar12 = uVar12 * 2;
        (t1->mqc).a = uVar12;
        uVar16 = uVar16 * 2;
        (t1->mqc).c = uVar16;
        OVar24 = OVar24 - 1;
        (t1->mqc).ct = OVar24;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = uVar16 + uVar12 * -0x10000;
      (t1->mqc).c = OVar24;
      if (-1 < (short)uVar17) {
        (t1->mqc).ctxs[0x12] = (&poVar7->nmps)[uVar17 < uVar12];
        OVar29 = (t1->mqc).ct;
        do {
          if (OVar29 == 0) {
            pOVar8 = (t1->mqc).bp;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                (t1->mqc).bp = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                (t1->mqc).c = OVar24;
                (t1->mqc).ct = 7;
                OVar29 = 7;
                goto LAB_0013e4d8;
              }
              OVar24 = OVar24 + 0xff00;
              (t1->mqc).c = OVar24;
              (t1->mqc).ct = 8;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              (t1->mqc).bp = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
              (t1->mqc).c = OVar24;
              (t1->mqc).ct = 8;
            }
            OVar29 = 8;
          }
LAB_0013e4d8:
          uVar17 = uVar17 * 2;
          (t1->mqc).a = uVar17;
          OVar24 = OVar24 * 2;
          (t1->mqc).c = OVar24;
          OVar29 = OVar29 - 1;
          (t1->mqc).ct = OVar29;
        } while (uVar17 < 0x8000);
      }
    }
    ppoVar15 = (t1->mqc).curctx;
    poVar7 = *ppoVar15;
    uVar12 = poVar7->qeval;
    uVar16 = (t1->mqc).c;
    uVar17 = (t1->mqc).a - uVar12;
    (t1->mqc).a = uVar17;
    if (uVar16 >> 0x10 < uVar12) {
      (t1->mqc).a = uVar12;
      *ppoVar15 = (&poVar7->nmps)[uVar12 <= uVar17];
      uVar12 = (t1->mqc).a;
      OVar24 = (t1->mqc).ct;
      do {
        if (OVar24 == 0) {
          pOVar8 = (t1->mqc).bp;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              (t1->mqc).bp = pOVar8 + 1;
              uVar16 = uVar16 + (uint)bVar6 * 0x200;
              (t1->mqc).c = uVar16;
              (t1->mqc).ct = 7;
              OVar24 = 7;
              goto LAB_0013e5b1;
            }
            uVar16 = uVar16 + 0xff00;
            (t1->mqc).c = uVar16;
            (t1->mqc).ct = 8;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            (t1->mqc).bp = pOVar8 + 1;
            uVar16 = uVar16 + (uint)bVar6 * 0x100;
            (t1->mqc).c = uVar16;
            (t1->mqc).ct = 8;
          }
          OVar24 = 8;
        }
LAB_0013e5b1:
        uVar12 = uVar12 * 2;
        (t1->mqc).a = uVar12;
        uVar16 = uVar16 * 2;
        (t1->mqc).c = uVar16;
        OVar24 = OVar24 - 1;
        (t1->mqc).ct = OVar24;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = uVar16 + uVar12 * -0x10000;
      (t1->mqc).c = OVar24;
      if (-1 < (short)uVar17) {
        *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar12];
        OVar29 = (t1->mqc).ct;
        do {
          if (OVar29 == 0) {
            pOVar8 = (t1->mqc).bp;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                (t1->mqc).bp = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                (t1->mqc).c = OVar24;
                (t1->mqc).ct = 7;
                OVar29 = 7;
                goto LAB_0013e66d;
              }
              OVar24 = OVar24 + 0xff00;
              (t1->mqc).c = OVar24;
              (t1->mqc).ct = 8;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              (t1->mqc).bp = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
              (t1->mqc).c = OVar24;
              (t1->mqc).ct = 8;
            }
            OVar29 = 8;
          }
LAB_0013e66d:
          uVar17 = uVar17 * 2;
          (t1->mqc).a = uVar17;
          OVar24 = OVar24 * 2;
          (t1->mqc).c = OVar24;
          OVar29 = OVar29 - 1;
          (t1->mqc).ct = OVar29;
        } while (uVar17 < 0x8000);
      }
    }
  }
  return;
switchD_0013abd0_caseD_0:
  uVar21 = flagsp[1] >> 0x11 & 4 | flagsp[-1] >> 0x13 & 1;
  bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
          [uVar21];
  poVar7 = (t1->mqc).ctxs[bVar6];
  uVar27 = poVar7->qeval;
  uVar17 = uVar17 - uVar27;
  if ((uint)(uVar9 >> 0x10) < uVar27) {
    OVar29 = (uint)(poVar7->mps == 0);
    if (uVar27 > uVar17) {
      OVar29 = poVar7->mps;
    }
    (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar27 <= uVar17];
    uVar17 = uVar27;
    do {
      iVar33 = (int)uVar9;
      if (OVar24 == 0) {
        pOVar8 = *ppOVar1;
        bVar6 = pOVar8[1];
        if (*pOVar8 == 0xff) {
          if (bVar6 < 0x90) {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x200;
            OVar24 = 7;
            goto LAB_0013ac73;
          }
          iVar33 = iVar33 + 0xff00;
          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
          *pOVar2 = *pOVar2 + 1;
        }
        else {
          *ppOVar1 = pOVar8 + 1;
          iVar33 = iVar33 + (uint)bVar6 * 0x100;
        }
        OVar24 = 8;
      }
LAB_0013ac73:
      uVar17 = uVar17 * 2;
      uVar9 = (ulong)(uint)(iVar33 * 2);
      OVar24 = OVar24 - 1;
    } while (uVar17 < 0x8000);
  }
  else {
    uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
    if ((short)uVar17 < 0) {
      OVar29 = poVar7->mps;
    }
    else {
      OVar29 = (uint)(poVar7->mps == 0);
      if (uVar17 >= uVar27) {
        OVar29 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar17 < uVar27];
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_0013b6bb;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_0013b6bb:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
  }
  bVar6 = ""[uVar21];
  uVar27 = uVar32;
  if (OVar29 == bVar6) {
    uVar27 = uVar25;
  }
  *puVar14 = uVar27;
  *(byte *)(flagsp + -1) = (byte)flagsp[-1] | 0x20;
  uVar13 = (ulong)((OVar29 ^ bVar6) << 0x13 | 0x10);
  *(byte *)(flagsp + 1) = (byte)flagsp[1] | 8;
switchD_0013abd0_caseD_1:
  if (uVar28 == 0) {
    bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar13 >> 3) & 0x1ef];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar27 = poVar7->qeval;
    uVar17 = uVar17 - uVar27;
    if ((uint)(uVar9 >> 0x10) < uVar27) {
      uVar28 = (uint)(poVar7->mps == 0);
      if (uVar27 > uVar17) {
        uVar28 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar27 <= uVar17];
      uVar17 = uVar27;
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_0013b7b3;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_0013b7b3:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
    else {
      uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
      if ((short)uVar17 < 0) {
        uVar28 = poVar7->mps;
      }
      else {
        uVar28 = (uint)(poVar7->mps == 0);
        if (uVar17 >= uVar27) {
          uVar28 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar17 < uVar27];
        do {
          iVar33 = (int)uVar9;
          if (OVar24 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                iVar33 = iVar33 + (uint)bVar6 * 0x200;
                OVar24 = 7;
                goto LAB_0013b846;
              }
              iVar33 = iVar33 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x100;
            }
            OVar24 = 8;
          }
LAB_0013b846:
          uVar17 = uVar17 * 2;
          uVar9 = (ulong)(uint)(iVar33 * 2);
          OVar24 = OVar24 - 1;
        } while (uVar17 < 0x8000);
      }
    }
    if (uVar28 != 0) goto LAB_0013b87b;
    bVar34 = true;
  }
  else {
LAB_0013b87b:
    uVar28 = (uint)(uVar13 >> 0x13) & 0x40 | (uint)(uVar13 >> 3) & 0xaa |
             (uint)(uVar13 >> 0xf) & 0x10 | flagsp[-1] >> 0x16 & 1 | flagsp[1] >> 0x14 & 4;
    bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
            [uVar28];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar27 = poVar7->qeval;
    uVar17 = uVar17 - uVar27;
    if ((uint)(uVar9 >> 0x10) < uVar27) {
      OVar29 = (uint)(poVar7->mps == 0);
      if (uVar27 > uVar17) {
        OVar29 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar27 <= uVar17];
      uVar17 = uVar27;
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_0013b943;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_0013b943:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
    else {
      uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
      if ((short)uVar17 < 0) {
        OVar29 = poVar7->mps;
      }
      else {
        OVar29 = (uint)(poVar7->mps == 0);
        if (uVar17 >= uVar27) {
          OVar29 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar17 < uVar27];
        do {
          iVar33 = (int)uVar9;
          if (OVar24 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                iVar33 = iVar33 + (uint)bVar6 * 0x200;
                OVar24 = 7;
                goto LAB_0013b9e1;
              }
              iVar33 = iVar33 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x100;
            }
            OVar24 = 8;
          }
LAB_0013b9e1:
          uVar17 = uVar17 * 2;
          uVar9 = (ulong)(uint)(iVar33 * 2);
          OVar24 = OVar24 - 1;
        } while (uVar17 < 0x8000);
      }
    }
    bVar6 = ""[uVar28];
    uVar27 = uVar32;
    if (OVar29 == bVar6) {
      uVar27 = uVar25;
    }
    puVar14[uVar30] = uVar27;
    *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 1;
    uVar13 = (ulong)((uint)uVar13 | (OVar29 ^ bVar6) << 0x16 | 0x80);
    *(byte *)(flagsp + 1) = (byte)flagsp[1] | 0x40;
    bVar34 = true;
  }
LAB_0013ba56:
  if (bVar34) {
    bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar13 >> 6) & 0x1ef];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar27 = poVar7->qeval;
    uVar17 = uVar17 - uVar27;
    if ((uint)(uVar9 >> 0x10) < uVar27) {
      uVar28 = (uint)(poVar7->mps == 0);
      if (uVar27 > uVar17) {
        uVar28 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar27 <= uVar17];
      uVar17 = uVar27;
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_0013bae4;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_0013bae4:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
    else {
      uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
      if ((short)uVar17 < 0) {
        uVar28 = poVar7->mps;
      }
      else {
        uVar28 = (uint)(poVar7->mps == 0);
        if (uVar17 >= uVar27) {
          uVar28 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar17 < uVar27];
        do {
          iVar33 = (int)uVar9;
          if (OVar24 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                iVar33 = iVar33 + (uint)bVar6 * 0x200;
                OVar24 = 7;
                goto LAB_0013bb77;
              }
              iVar33 = iVar33 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x100;
            }
            OVar24 = 8;
          }
LAB_0013bb77:
          uVar17 = uVar17 * 2;
          uVar9 = (ulong)(uint)(iVar33 * 2);
          OVar24 = OVar24 - 1;
        } while (uVar17 < 0x8000);
      }
    }
    if (uVar28 != 0) goto LAB_0013bbac;
    bVar34 = true;
  }
  else {
LAB_0013bbac:
    uVar28 = (uint)(uVar13 >> 0x16) & 0x40 | (uint)(uVar13 >> 6) & 0xaa |
             (uint)(uVar13 >> 0x12) & 0x10 | flagsp[-1] >> 0x19 & 1 | flagsp[1] >> 0x17 & 4;
    bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
            [uVar28];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar27 = poVar7->qeval;
    uVar17 = uVar17 - uVar27;
    if ((uint)(uVar9 >> 0x10) < uVar27) {
      OVar29 = (uint)(poVar7->mps == 0);
      if (uVar27 > uVar17) {
        OVar29 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar27 <= uVar17];
      uVar17 = uVar27;
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_0013bc74;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_0013bc74:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
    else {
      uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
      if ((short)uVar17 < 0) {
        OVar29 = poVar7->mps;
      }
      else {
        OVar29 = (uint)(poVar7->mps == 0);
        if (uVar17 >= uVar27) {
          OVar29 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar17 < uVar27];
        do {
          iVar33 = (int)uVar9;
          if (OVar24 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                iVar33 = iVar33 + (uint)bVar6 * 0x200;
                OVar24 = 7;
                goto LAB_0013bd12;
              }
              iVar33 = iVar33 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x100;
            }
            OVar24 = 8;
          }
LAB_0013bd12:
          uVar17 = uVar17 * 2;
          uVar9 = (ulong)(uint)(iVar33 * 2);
          OVar24 = OVar24 - 1;
        } while (uVar17 < 0x8000);
      }
    }
    bVar6 = ""[uVar28];
    uVar27 = uVar32;
    if (OVar29 == bVar6) {
      uVar27 = uVar25;
    }
    puVar14[uVar12 * 2] = uVar27;
    *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 8;
    uVar13 = (ulong)((uint)uVar13 | (OVar29 ^ bVar6) << 0x19 | 0x400);
    *(byte *)((long)flagsp + 5) = *(byte *)((long)flagsp + 5) | 2;
    bVar34 = true;
  }
LAB_0013bd87:
  uVar27 = (uint)uVar13;
  if (bVar34) {
    bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar13 >> 9) & 0x1ef];
    ppoVar15 = (t1->mqc).ctxs + bVar6;
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar28 = poVar7->qeval;
    uVar17 = uVar17 - uVar28;
    if ((uint)(uVar9 >> 0x10) < uVar28) {
      OVar29 = (uint)(poVar7->mps == 0);
      if (uVar28 > uVar17) {
        OVar29 = poVar7->mps;
      }
      *ppoVar15 = (&poVar7->nmps)[uVar28 <= uVar17];
      uVar17 = uVar28;
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_0013be1e;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_0013be1e:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
    else {
      uVar9 = (ulong)((int)uVar9 + uVar28 * -0x10000);
      if ((short)uVar17 < 0) {
        OVar29 = poVar7->mps;
      }
      else {
        OVar29 = (uint)(poVar7->mps == 0);
        if (uVar17 >= uVar28) {
          OVar29 = poVar7->mps;
        }
        *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar28];
        do {
          iVar33 = (int)uVar9;
          if (OVar24 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                iVar33 = iVar33 + (uint)bVar6 * 0x200;
                OVar24 = 7;
                goto LAB_0013beac;
              }
              iVar33 = iVar33 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x100;
            }
            OVar24 = 8;
          }
LAB_0013beac:
          uVar17 = uVar17 * 2;
          uVar9 = (ulong)(uint)(iVar33 * 2);
          OVar24 = OVar24 - 1;
        } while (uVar17 < 0x8000);
      }
    }
    if (OVar29 == 0) goto switchD_0013abd0_default;
  }
  uVar21 = (uint)(uVar13 >> 0x19) & 0x40 | (uint)(uVar13 >> 9) & 0xaa |
           (uint)(uVar13 >> 0x15) & 0x10 | flagsp[-1] >> 0x1c & 1 | flagsp[1] >> 0x1a & 4;
  ppoVar15 = (t1->mqc).ctxs +
             "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
             [uVar21];
  poVar7 = *ppoVar15;
  uVar28 = poVar7->qeval;
  uVar17 = uVar17 - uVar28;
  if ((uint)(uVar9 >> 0x10) < uVar28) {
    OVar29 = (uint)(poVar7->mps == 0);
    if (uVar28 > uVar17) {
      OVar29 = poVar7->mps;
    }
    *ppoVar15 = (&poVar7->nmps)[uVar28 <= uVar17];
    uVar17 = uVar28;
    do {
      iVar33 = (int)uVar9;
      if (OVar24 == 0) {
        pOVar8 = *ppOVar1;
        bVar6 = pOVar8[1];
        if (*pOVar8 == 0xff) {
          if (bVar6 < 0x90) {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x200;
            OVar24 = 7;
            goto LAB_0013bfae;
          }
          iVar33 = iVar33 + 0xff00;
          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
          *pOVar2 = *pOVar2 + 1;
        }
        else {
          *ppOVar1 = pOVar8 + 1;
          iVar33 = iVar33 + (uint)bVar6 * 0x100;
        }
        OVar24 = 8;
      }
LAB_0013bfae:
      uVar17 = uVar17 * 2;
      uVar9 = (ulong)(uint)(iVar33 * 2);
      OVar24 = OVar24 - 1;
    } while (uVar17 < 0x8000);
  }
  else {
    uVar9 = (ulong)((int)uVar9 + uVar28 * -0x10000);
    if ((short)uVar17 < 0) {
      OVar29 = poVar7->mps;
    }
    else {
      OVar29 = (uint)(poVar7->mps == 0);
      if (uVar17 >= uVar28) {
        OVar29 = poVar7->mps;
      }
      *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar28];
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_0013c03f;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_0013c03f:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
  }
  uVar22 = OVar29 ^ ""[uVar21];
  uVar28 = uVar32;
  if (OVar29 == ""[uVar21]) {
    uVar28 = uVar25;
  }
  puVar14[uVar18] = uVar28;
  *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 0x40;
  *(byte *)((long)flagsp + 5) = *(byte *)((long)flagsp + 5) | 0x10;
  uVar13 = (ulong)(t1->w + 2);
  flagsp[uVar13] = uVar22 << 0x12 | flagsp[uVar13] | 2;
  *(byte *)(flagsp + (uVar13 - 1)) = (byte)flagsp[uVar13 - 1] | 4;
  uVar27 = uVar27 | uVar22 << 0x1c | 0x2000;
  *(byte *)(flagsp + uVar13 + 1) = (byte)flagsp[uVar13 + 1] | 1;
switchD_0013abd0_default:
  if (uVar19 != 0) goto LAB_0013c0da;
LAB_0013c0e4:
  uVar16 = uVar16 + 1;
  puVar14 = puVar14 + 1;
  flagsp = flagsp + 1;
  if (uVar16 == uVar12) goto LAB_0013c10b;
  goto LAB_0013a538;
switchD_00138ebf_caseD_0:
  uVar28 = flagsp[1] >> 0x11 & 4 | flagsp[-1] >> 0x13 & 1;
  bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
          [uVar28];
  poVar7 = (t1->mqc).ctxs[bVar6];
  uVar27 = poVar7->qeval;
  uVar17 = uVar17 - uVar27;
  if ((uint)(uVar9 >> 0x10) < uVar27) {
    uVar21 = (uint)(poVar7->mps == 0);
    if (uVar27 > uVar17) {
      uVar21 = poVar7->mps;
    }
    (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar27 <= uVar17];
    uVar17 = uVar27;
    do {
      iVar33 = (int)uVar9;
      if (OVar24 == 0) {
        pOVar8 = *ppOVar1;
        bVar6 = pOVar8[1];
        if (*pOVar8 == 0xff) {
          if (bVar6 < 0x90) {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x200;
            OVar24 = 7;
            goto LAB_00138f5d;
          }
          iVar33 = iVar33 + 0xff00;
          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
          *pOVar2 = *pOVar2 + 1;
        }
        else {
          *ppOVar1 = pOVar8 + 1;
          iVar33 = iVar33 + (uint)bVar6 * 0x100;
        }
        OVar24 = 8;
      }
LAB_00138f5d:
      uVar17 = uVar17 * 2;
      uVar9 = (ulong)(uint)(iVar33 * 2);
      OVar24 = OVar24 - 1;
    } while (uVar17 < 0x8000);
  }
  else {
    uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
    if ((short)uVar17 < 0) {
      uVar21 = poVar7->mps;
    }
    else {
      uVar21 = (uint)(poVar7->mps == 0);
      if (uVar17 >= uVar27) {
        uVar21 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar17 < uVar27];
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_001399dc;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_001399dc:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
  }
  uVar22 = uVar21 ^ ""[uVar28];
  uVar27 = uVar32;
  if (uVar21 == ""[uVar28]) {
    uVar27 = uVar25;
  }
  *puVar14 = uVar27;
  *(byte *)(flagsp + -1) = (byte)flagsp[-1] | 0x20;
  *(byte *)(flagsp + 1) = (byte)flagsp[1] | 8;
  uVar13 = (ulong)(t1->w + 2);
  puVar10 = flagsp + -uVar13;
  *puVar10 = uVar22 << 0x1f | *puVar10 | 0x10000;
  pbVar3 = (byte *)((long)flagsp + uVar13 * -4 + -2);
  *pbVar3 = *pbVar3 | 2;
  uVar13 = (ulong)(uVar22 << 0x13 | 0x10);
  *(byte *)((long)puVar10 + 5) = *(byte *)((long)puVar10 + 5) | 0x80;
switchD_00138ebf_caseD_1:
  if (uVar19 == 0) {
    bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar13 >> 3) & 0x1ef];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar27 = poVar7->qeval;
    uVar17 = uVar17 - uVar27;
    if ((uint)(uVar9 >> 0x10) < uVar27) {
      uVar19 = (uint)(poVar7->mps == 0);
      if (uVar27 > uVar17) {
        uVar19 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar27 <= uVar17];
      uVar17 = uVar27;
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_00139b03;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_00139b03:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
    else {
      uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
      if ((short)uVar17 < 0) {
        uVar19 = poVar7->mps;
      }
      else {
        uVar19 = (uint)(poVar7->mps == 0);
        if (uVar17 >= uVar27) {
          uVar19 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar17 < uVar27];
        do {
          iVar33 = (int)uVar9;
          if (OVar24 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                iVar33 = iVar33 + (uint)bVar6 * 0x200;
                OVar24 = 7;
                goto LAB_00139b8b;
              }
              iVar33 = iVar33 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x100;
            }
            OVar24 = 8;
          }
LAB_00139b8b:
          uVar17 = uVar17 * 2;
          uVar9 = (ulong)(uint)(iVar33 * 2);
          OVar24 = OVar24 - 1;
        } while (uVar17 < 0x8000);
      }
    }
    if (uVar19 != 0) goto LAB_00139bbc;
  }
  else {
LAB_00139bbc:
    uVar19 = (uint)(uVar13 >> 0x13) & 0x40 | (uint)(uVar13 >> 3) & 0xaa |
             (uint)(uVar13 >> 0xf) & 0x10 | flagsp[-1] >> 0x16 & 1 | flagsp[1] >> 0x14 & 4;
    bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
            [uVar19];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar27 = poVar7->qeval;
    uVar17 = uVar17 - uVar27;
    if ((uint)(uVar9 >> 0x10) < uVar27) {
      OVar26 = (uint)(poVar7->mps == 0);
      if (uVar27 > uVar17) {
        OVar26 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar27 <= uVar17];
      uVar17 = uVar27;
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_00139c7b;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_00139c7b:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
    else {
      uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
      if ((short)uVar17 < 0) {
        OVar26 = poVar7->mps;
      }
      else {
        OVar26 = (uint)(poVar7->mps == 0);
        if (uVar17 >= uVar27) {
          OVar26 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar17 < uVar27];
        do {
          iVar33 = (int)uVar9;
          if (OVar24 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                iVar33 = iVar33 + (uint)bVar6 * 0x200;
                OVar24 = 7;
                goto LAB_00139d10;
              }
              iVar33 = iVar33 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x100;
            }
            OVar24 = 8;
          }
LAB_00139d10:
          uVar17 = uVar17 * 2;
          uVar9 = (ulong)(uint)(iVar33 * 2);
          OVar24 = OVar24 - 1;
        } while (uVar17 < 0x8000);
      }
    }
    bVar6 = ""[uVar19];
    uVar27 = uVar32;
    if (OVar26 == bVar6) {
      uVar27 = uVar25;
    }
    puVar14[uVar30] = uVar27;
    *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 1;
    uVar13 = (ulong)((uint)uVar13 | (OVar26 ^ bVar6) << 0x16 | 0x80);
    *(byte *)(flagsp + 1) = (byte)flagsp[1] | 0x40;
  }
  bVar34 = true;
LAB_00139d7d:
  if (bVar34) {
    bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar13 >> 6) & 0x1ef];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar27 = poVar7->qeval;
    uVar17 = uVar17 - uVar27;
    if ((uint)(uVar9 >> 0x10) < uVar27) {
      uVar19 = (uint)(poVar7->mps == 0);
      if (uVar27 > uVar17) {
        uVar19 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar27 <= uVar17];
      uVar17 = uVar27;
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_00139e0c;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_00139e0c:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
    else {
      uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
      if ((short)uVar17 < 0) {
        uVar19 = poVar7->mps;
      }
      else {
        uVar19 = (uint)(poVar7->mps == 0);
        if (uVar17 >= uVar27) {
          uVar19 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar17 < uVar27];
        do {
          iVar33 = (int)uVar9;
          if (OVar24 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                iVar33 = iVar33 + (uint)bVar6 * 0x200;
                OVar24 = 7;
                goto LAB_00139e94;
              }
              iVar33 = iVar33 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x100;
            }
            OVar24 = 8;
          }
LAB_00139e94:
          uVar17 = uVar17 * 2;
          uVar9 = (ulong)(uint)(iVar33 * 2);
          OVar24 = OVar24 - 1;
        } while (uVar17 < 0x8000);
      }
    }
    if (uVar19 != 0) goto LAB_00139ec5;
  }
  else {
LAB_00139ec5:
    uVar19 = (uint)(uVar13 >> 0x16) & 0x40 | (uint)(uVar13 >> 6) & 0xaa |
             (uint)(uVar13 >> 0x12) & 0x10 | flagsp[-1] >> 0x19 & 1 | flagsp[1] >> 0x17 & 4;
    bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
            [uVar19];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar27 = poVar7->qeval;
    uVar17 = uVar17 - uVar27;
    if ((uint)(uVar9 >> 0x10) < uVar27) {
      OVar26 = (uint)(poVar7->mps == 0);
      if (uVar27 > uVar17) {
        OVar26 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar27 <= uVar17];
      uVar17 = uVar27;
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_00139f84;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_00139f84:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
    else {
      uVar9 = (ulong)((int)uVar9 + uVar27 * -0x10000);
      if ((short)uVar17 < 0) {
        OVar26 = poVar7->mps;
      }
      else {
        OVar26 = (uint)(poVar7->mps == 0);
        if (uVar17 >= uVar27) {
          OVar26 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar17 < uVar27];
        do {
          iVar33 = (int)uVar9;
          if (OVar24 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                iVar33 = iVar33 + (uint)bVar6 * 0x200;
                OVar24 = 7;
                goto LAB_0013a019;
              }
              iVar33 = iVar33 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x100;
            }
            OVar24 = 8;
          }
LAB_0013a019:
          uVar17 = uVar17 * 2;
          uVar9 = (ulong)(uint)(iVar33 * 2);
          OVar24 = OVar24 - 1;
        } while (uVar17 < 0x8000);
      }
    }
    bVar6 = ""[uVar19];
    uVar27 = uVar32;
    if (OVar26 == bVar6) {
      uVar27 = uVar25;
    }
    puVar14[uVar12 * 2] = uVar27;
    *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 8;
    uVar13 = (ulong)((uint)uVar13 | (OVar26 ^ bVar6) << 0x19 | 0x400);
    *(byte *)((long)flagsp + 5) = *(byte *)((long)flagsp + 5) | 2;
  }
  bVar34 = true;
LAB_0013a086:
  uVar27 = (uint)uVar13;
  if (bVar34) {
    bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar13 >> 9) & 0x1ef];
    ppoVar15 = (t1->mqc).ctxs + bVar6;
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar19 = poVar7->qeval;
    uVar17 = uVar17 - uVar19;
    if ((uint)(uVar9 >> 0x10) < uVar19) {
      OVar26 = (uint)(poVar7->mps == 0);
      if (uVar19 > uVar17) {
        OVar26 = poVar7->mps;
      }
      *ppoVar15 = (&poVar7->nmps)[uVar19 <= uVar17];
      uVar17 = uVar19;
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_0013a11d;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_0013a11d:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
    else {
      uVar9 = (ulong)((int)uVar9 + uVar19 * -0x10000);
      if ((short)uVar17 < 0) {
        OVar26 = poVar7->mps;
      }
      else {
        OVar26 = (uint)(poVar7->mps == 0);
        if (uVar17 >= uVar19) {
          OVar26 = poVar7->mps;
        }
        *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar19];
        do {
          iVar33 = (int)uVar9;
          if (OVar24 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                iVar33 = iVar33 + (uint)bVar6 * 0x200;
                OVar24 = 7;
                goto LAB_0013a1a3;
              }
              iVar33 = iVar33 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x100;
            }
            OVar24 = 8;
          }
LAB_0013a1a3:
          uVar17 = uVar17 * 2;
          uVar9 = (ulong)(uint)(iVar33 * 2);
          OVar24 = OVar24 - 1;
        } while (uVar17 < 0x8000);
      }
    }
    if (OVar26 == 0) goto switchD_00138ebf_default;
  }
  uVar28 = (uint)(uVar13 >> 0x19) & 0x40 | (uint)(uVar13 >> 9) & 0xaa |
           (uint)(uVar13 >> 0x15) & 0x10 | flagsp[-1] >> 0x1c & 1 | flagsp[1] >> 0x1a & 4;
  ppoVar15 = (t1->mqc).ctxs +
             "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
             [uVar28];
  poVar7 = *ppoVar15;
  uVar19 = poVar7->qeval;
  uVar17 = uVar17 - uVar19;
  if ((uint)(uVar9 >> 0x10) < uVar19) {
    OVar26 = (uint)(poVar7->mps == 0);
    if (uVar19 > uVar17) {
      OVar26 = poVar7->mps;
    }
    *ppoVar15 = (&poVar7->nmps)[uVar19 <= uVar17];
    uVar17 = uVar19;
    do {
      iVar33 = (int)uVar9;
      if (OVar24 == 0) {
        pOVar8 = *ppOVar1;
        bVar6 = pOVar8[1];
        if (*pOVar8 == 0xff) {
          if (bVar6 < 0x90) {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x200;
            OVar24 = 7;
            goto LAB_0013a29a;
          }
          iVar33 = iVar33 + 0xff00;
          pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
          *pOVar2 = *pOVar2 + 1;
        }
        else {
          *ppOVar1 = pOVar8 + 1;
          iVar33 = iVar33 + (uint)bVar6 * 0x100;
        }
        OVar24 = 8;
      }
LAB_0013a29a:
      uVar17 = uVar17 * 2;
      uVar9 = (ulong)(uint)(iVar33 * 2);
      OVar24 = OVar24 - 1;
    } while (uVar17 < 0x8000);
  }
  else {
    uVar9 = (ulong)((int)uVar9 + uVar19 * -0x10000);
    if ((short)uVar17 < 0) {
      OVar26 = poVar7->mps;
    }
    else {
      OVar26 = (uint)(poVar7->mps == 0);
      if (uVar17 >= uVar19) {
        OVar26 = poVar7->mps;
      }
      *ppoVar15 = (&poVar7->nmps)[uVar17 < uVar19];
      do {
        iVar33 = (int)uVar9;
        if (OVar24 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              iVar33 = iVar33 + (uint)bVar6 * 0x200;
              OVar24 = 7;
              goto LAB_0013a323;
            }
            iVar33 = iVar33 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            iVar33 = iVar33 + (uint)bVar6 * 0x100;
          }
          OVar24 = 8;
        }
LAB_0013a323:
        uVar17 = uVar17 * 2;
        uVar9 = (ulong)(uint)(iVar33 * 2);
        OVar24 = OVar24 - 1;
      } while (uVar17 < 0x8000);
    }
  }
  uVar21 = OVar26 ^ ""[uVar28];
  uVar19 = uVar32;
  if (OVar26 == ""[uVar28]) {
    uVar19 = uVar25;
  }
  puVar14[uVar18] = uVar19;
  *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 0x40;
  *(byte *)((long)flagsp + 5) = *(byte *)((long)flagsp + 5) | 0x10;
  uVar13 = (ulong)(t1->w + 2);
  flagsp[uVar13] = uVar21 << 0x12 | flagsp[uVar13] | 2;
  *(byte *)(flagsp + (uVar13 - 1)) = (byte)flagsp[uVar13 - 1] | 4;
  uVar27 = uVar27 | uVar21 << 0x1c | 0x2000;
  *(byte *)(flagsp + uVar13 + 1) = (byte)flagsp[uVar13 + 1] | 1;
switchD_00138ebf_default:
  if (OVar29 != 0) goto LAB_0013a3c3;
LAB_0013a3cd:
  uVar16 = uVar16 + 1;
  puVar14 = puVar14 + 1;
  flagsp = flagsp + 1;
  if (uVar16 == uVar12) goto LAB_0013a3ea;
  goto LAB_00138833;
switchD_0013c928_caseD_0:
  uVar18 = puVar11[1] >> 0x11 & 4 | puVar11[-1] >> 0x13 & 1;
  bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
          [uVar18];
  poVar7 = (t1->mqc).ctxs[bVar6];
  uVar25 = poVar7->qeval;
  uVar12 = uVar12 - uVar25;
  if (OVar24 >> 0x10 < uVar25) {
    OVar26 = (uint)(poVar7->mps == 0);
    if (uVar25 > uVar12) {
      OVar26 = poVar7->mps;
    }
    (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar25 <= uVar12];
    uVar12 = uVar25;
    do {
      if (OVar29 == 0) {
        pOVar8 = *ppOVar1;
        bVar6 = pOVar8[1];
        if (*pOVar8 == 0xff) {
          if (bVar6 < 0x90) {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x200;
            OVar29 = 7;
            goto LAB_0013c9d1;
          }
          OVar24 = OVar24 + 0xff00;
          *pOVar2 = *pOVar2 + 1;
        }
        else {
          *ppOVar1 = pOVar8 + 1;
          OVar24 = OVar24 + (uint)bVar6 * 0x100;
        }
        OVar29 = 8;
      }
LAB_0013c9d1:
      uVar12 = uVar12 * 2;
      OVar24 = OVar24 * 2;
      OVar29 = OVar29 - 1;
    } while (uVar12 < 0x8000);
  }
  else {
    OVar24 = OVar24 + uVar25 * -0x10000;
    if ((short)uVar12 < 0) {
      OVar26 = poVar7->mps;
    }
    else {
      OVar26 = (uint)(poVar7->mps == 0);
      if (uVar12 >= uVar25) {
        OVar26 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar12 < uVar25];
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_0013d52c;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_0013d52c:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
  }
  bVar6 = ""[uVar18];
  uVar25 = uVar17;
  if (OVar26 == bVar6) {
    uVar25 = uVar16;
  }
  *puVar23 = uVar25;
  *(byte *)(puVar11 + -1) = (byte)puVar11[-1] | 0x20;
  uVar30 = (ulong)((OVar26 ^ bVar6) << 0x13 | 0x10);
  *(byte *)(puVar11 + 1) = (byte)puVar11[1] | 8;
switchD_0013c928_caseD_1:
  if (uVar32 == 0) {
    bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar30 >> 3) & 0x1ef];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar25 = poVar7->qeval;
    uVar12 = uVar12 - uVar25;
    if (OVar24 >> 0x10 < uVar25) {
      uVar18 = (uint)(poVar7->mps == 0);
      if (uVar25 > uVar12) {
        uVar18 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar25 <= uVar12];
      uVar12 = uVar25;
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_0013d632;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_0013d632:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = OVar24 + uVar25 * -0x10000;
      if ((short)uVar12 < 0) {
        uVar18 = poVar7->mps;
      }
      else {
        uVar18 = (uint)(poVar7->mps == 0);
        if (uVar12 >= uVar25) {
          uVar18 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar12 < uVar25];
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_0013d6ca;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_0013d6ca:
          uVar12 = uVar12 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar12 < 0x8000);
      }
    }
    if (uVar18 != 0) goto LAB_0013d705;
    bVar34 = true;
  }
  else {
LAB_0013d705:
    uVar18 = (uint)(uVar30 >> 0x13) & 0x40 | (uint)(uVar30 >> 3) & 0xaa |
             (uint)(uVar30 >> 0xf) & 0x10 | puVar11[-1] >> 0x16 & 1 | puVar11[1] >> 0x14 & 4;
    bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
            [uVar18];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar25 = poVar7->qeval;
    uVar12 = uVar12 - uVar25;
    if (OVar24 >> 0x10 < uVar25) {
      OVar26 = (uint)(poVar7->mps == 0);
      if (uVar25 > uVar12) {
        OVar26 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar25 <= uVar12];
      uVar12 = uVar25;
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_0013d7d4;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_0013d7d4:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = OVar24 + uVar25 * -0x10000;
      if ((short)uVar12 < 0) {
        OVar26 = poVar7->mps;
      }
      else {
        OVar26 = (uint)(poVar7->mps == 0);
        if (uVar12 >= uVar25) {
          OVar26 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar12 < uVar25];
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_0013d875;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_0013d875:
          uVar12 = uVar12 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar12 < 0x8000);
      }
    }
    bVar6 = ""[uVar18];
    uVar25 = uVar17;
    if (OVar26 == bVar6) {
      uVar25 = uVar16;
    }
    puVar23[0x40] = uVar25;
    *(byte *)((long)puVar11 + -3) = *(byte *)((long)puVar11 + -3) | 1;
    uVar30 = (ulong)((uint)uVar30 | (OVar26 ^ bVar6) << 0x16 | 0x80);
    *(byte *)(puVar11 + 1) = (byte)puVar11[1] | 0x40;
    bVar34 = true;
  }
LAB_0013d8ea:
  if (bVar34) {
    bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar30 >> 6) & 0x1ef];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar25 = poVar7->qeval;
    uVar12 = uVar12 - uVar25;
    if (OVar24 >> 0x10 < uVar25) {
      uVar18 = (uint)(poVar7->mps == 0);
      if (uVar25 > uVar12) {
        uVar18 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar25 <= uVar12];
      uVar12 = uVar25;
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_0013d97f;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_0013d97f:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = OVar24 + uVar25 * -0x10000;
      if ((short)uVar12 < 0) {
        uVar18 = poVar7->mps;
      }
      else {
        uVar18 = (uint)(poVar7->mps == 0);
        if (uVar12 >= uVar25) {
          uVar18 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar12 < uVar25];
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_0013da21;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_0013da21:
          uVar12 = uVar12 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar12 < 0x8000);
      }
    }
    if (uVar18 != 0) goto LAB_0013da5c;
    bVar34 = true;
  }
  else {
LAB_0013da5c:
    uVar18 = (uint)(uVar30 >> 0x16) & 0x40 | (uint)(uVar30 >> 6) & 0xaa |
             (uint)(uVar30 >> 0x12) & 0x10 | puVar11[-1] >> 0x19 & 1 | puVar11[1] >> 0x17 & 4;
    bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
            [uVar18];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar25 = poVar7->qeval;
    uVar12 = uVar12 - uVar25;
    if (OVar24 >> 0x10 < uVar25) {
      OVar26 = (uint)(poVar7->mps == 0);
      if (uVar25 > uVar12) {
        OVar26 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar25 <= uVar12];
      uVar12 = uVar25;
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_0013db2b;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_0013db2b:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = OVar24 + uVar25 * -0x10000;
      if ((short)uVar12 < 0) {
        OVar26 = poVar7->mps;
      }
      else {
        OVar26 = (uint)(poVar7->mps == 0);
        if (uVar12 >= uVar25) {
          OVar26 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar12 < uVar25];
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_0013dbcc;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_0013dbcc:
          uVar12 = uVar12 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar12 < 0x8000);
      }
    }
    bVar6 = ""[uVar18];
    uVar25 = uVar17;
    if (OVar26 == bVar6) {
      uVar25 = uVar16;
    }
    puVar23[0x80] = uVar25;
    *(byte *)((long)puVar11 + -3) = *(byte *)((long)puVar11 + -3) | 8;
    uVar30 = (ulong)((uint)uVar30 | (OVar26 ^ bVar6) << 0x19 | 0x400);
    *(byte *)((long)puVar11 + 5) = *(byte *)((long)puVar11 + 5) | 2;
    bVar34 = true;
  }
LAB_0013dc3c:
  uVar25 = (uint)uVar30;
  if (bVar34) {
    bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar30 >> 9) & 0x1ef];
    ppoVar15 = (t1->mqc).ctxs + bVar6;
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar18 = poVar7->qeval;
    uVar12 = uVar12 - uVar18;
    if (OVar24 >> 0x10 < uVar18) {
      uVar32 = (uint)(poVar7->mps == 0);
      if (uVar18 > uVar12) {
        uVar32 = poVar7->mps;
      }
      *ppoVar15 = (&poVar7->nmps)[uVar18 <= uVar12];
      uVar12 = uVar18;
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_0013dce0;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_0013dce0:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = OVar24 + uVar18 * -0x10000;
      if ((short)uVar12 < 0) {
        uVar32 = poVar7->mps;
      }
      else {
        uVar32 = (uint)(poVar7->mps == 0);
        if (uVar12 >= uVar18) {
          uVar32 = poVar7->mps;
        }
        *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar18];
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_0013dd7c;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_0013dd7c:
          uVar12 = uVar12 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar12 < 0x8000);
      }
    }
    if (uVar32 == 0) goto switchD_0013c928_default;
  }
  uVar32 = (uint)(uVar30 >> 0x19) & 0x40 | (uint)(uVar30 >> 9) & 0xaa |
           (uint)(uVar30 >> 0x15) & 0x10 | puVar11[-1] >> 0x1c & 1 | puVar11[1] >> 0x1a & 4;
  ppoVar15 = (t1->mqc).ctxs +
             "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
             [uVar32];
  poVar7 = *ppoVar15;
  uVar18 = poVar7->qeval;
  uVar12 = uVar12 - uVar18;
  if (OVar24 >> 0x10 < uVar18) {
    uVar19 = (uint)(poVar7->mps == 0);
    if (uVar18 > uVar12) {
      uVar19 = poVar7->mps;
    }
    *ppoVar15 = (&poVar7->nmps)[uVar18 <= uVar12];
    uVar12 = uVar18;
    do {
      if (OVar29 == 0) {
        pOVar8 = *ppOVar1;
        bVar6 = pOVar8[1];
        if (*pOVar8 == 0xff) {
          if (bVar6 < 0x90) {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x200;
            OVar29 = 7;
            goto LAB_0013de8e;
          }
          OVar24 = OVar24 + 0xff00;
          *pOVar2 = *pOVar2 + 1;
        }
        else {
          *ppOVar1 = pOVar8 + 1;
          OVar24 = OVar24 + (uint)bVar6 * 0x100;
        }
        OVar29 = 8;
      }
LAB_0013de8e:
      uVar12 = uVar12 * 2;
      OVar24 = OVar24 * 2;
      OVar29 = OVar29 - 1;
    } while (uVar12 < 0x8000);
  }
  else {
    OVar24 = OVar24 + uVar18 * -0x10000;
    if ((short)uVar12 < 0) {
      uVar19 = poVar7->mps;
    }
    else {
      uVar19 = (uint)(poVar7->mps == 0);
      if (uVar12 >= uVar18) {
        uVar19 = poVar7->mps;
      }
      *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar18];
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_0013df30;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_0013df30:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
  }
  uVar28 = uVar19 ^ ""[uVar32];
  uVar18 = uVar17;
  if (uVar19 == ""[uVar32]) {
    uVar18 = uVar16;
  }
  puVar23[0xc0] = uVar18;
  *(byte *)((long)puVar11 + -3) = *(byte *)((long)puVar11 + -3) | 0x40;
  *(byte *)((long)puVar11 + 5) = *(byte *)((long)puVar11 + 5) | 0x10;
  puVar11[0x42] = uVar28 << 0x12 | puVar11[0x42] | 2;
  *(byte *)(puVar11 + 0x41) = (byte)puVar11[0x41] | 4;
  uVar25 = uVar25 | uVar28 << 0x1c | 0x2000;
  *(byte *)(puVar11 + 0x43) = (byte)puVar11[0x43] | 1;
switchD_0013c928_default:
  if (uVar20 != 0) goto LAB_0013dfd0;
LAB_0013dfda:
  iVar33 = iVar33 + 1;
  puVar10 = puVar11 + 1;
  puVar14 = puVar23 + 1;
  if (iVar33 == 0x40) goto LAB_0013e004;
  goto LAB_0013c20b;
LAB_0013e004:
  puVar14 = puVar23 + 0xc1;
  puVar10 = puVar11 + 3;
  bVar34 = 0x3b < uVar27;
  uVar27 = uVar27 + 4;
  if (bVar34) goto LAB_0013e02b;
  goto LAB_0013c203;
switchD_00137090_caseD_0:
  uVar20 = puVar11[1] >> 0x11 & 4 | puVar11[-1] >> 0x13 & 1;
  bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
          [uVar20];
  poVar7 = (t1->mqc).ctxs[bVar6];
  uVar25 = poVar7->qeval;
  uVar12 = uVar12 - uVar25;
  if (OVar24 >> 0x10 < uVar25) {
    uVar32 = (uint)(poVar7->mps == 0);
    if (uVar25 > uVar12) {
      uVar32 = poVar7->mps;
    }
    (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar25 <= uVar12];
    uVar12 = uVar25;
    do {
      if (OVar29 == 0) {
        pOVar8 = *ppOVar1;
        bVar6 = pOVar8[1];
        if (*pOVar8 == 0xff) {
          if (bVar6 < 0x90) {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x200;
            OVar29 = 7;
            goto LAB_00137137;
          }
          OVar24 = OVar24 + 0xff00;
          *pOVar2 = *pOVar2 + 1;
        }
        else {
          *ppOVar1 = pOVar8 + 1;
          OVar24 = OVar24 + (uint)bVar6 * 0x100;
        }
        OVar29 = 8;
      }
LAB_00137137:
      uVar12 = uVar12 * 2;
      OVar24 = OVar24 * 2;
      OVar29 = OVar29 - 1;
    } while (uVar12 < 0x8000);
  }
  else {
    OVar24 = OVar24 + uVar25 * -0x10000;
    if ((short)uVar12 < 0) {
      uVar32 = poVar7->mps;
    }
    else {
      uVar32 = (uint)(poVar7->mps == 0);
      if (uVar12 >= uVar25) {
        uVar32 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar12 < uVar25];
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_00137c85;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_00137c85:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
  }
  uVar19 = uVar32 ^ ""[uVar20];
  uVar25 = uVar17;
  if (uVar32 == ""[uVar20]) {
    uVar25 = uVar16;
  }
  *puVar23 = uVar25;
  *(byte *)(puVar11 + -1) = (byte)puVar11[-1] | 0x20;
  *(byte *)(puVar11 + 1) = (byte)puVar11[1] | 8;
  puVar11[-0x42] = uVar19 << 0x1f | puVar11[-0x42] | 0x10000;
  *(byte *)((long)puVar11 + -0x10a) = *(byte *)((long)puVar11 + -0x10a) | 2;
  uVar30 = (ulong)(uVar19 << 0x13 | 0x10);
  *(byte *)((long)puVar11 + -0x103) = *(byte *)((long)puVar11 + -0x103) | 0x80;
switchD_00137090_caseD_1:
  if (uVar18 == 0) {
    bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar30 >> 3) & 0x1ef];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar25 = poVar7->qeval;
    uVar12 = uVar12 - uVar25;
    if (OVar24 >> 0x10 < uVar25) {
      uVar20 = (uint)(poVar7->mps == 0);
      if (uVar25 > uVar12) {
        uVar20 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar25 <= uVar12];
      uVar12 = uVar25;
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_00137db5;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_00137db5:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = OVar24 + uVar25 * -0x10000;
      if ((short)uVar12 < 0) {
        uVar20 = poVar7->mps;
      }
      else {
        uVar20 = (uint)(poVar7->mps == 0);
        if (uVar12 >= uVar25) {
          uVar20 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar12 < uVar25];
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_00137e47;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_00137e47:
          uVar12 = uVar12 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar12 < 0x8000);
      }
    }
    if (uVar20 != 0) goto LAB_00137e80;
    bVar34 = true;
  }
  else {
LAB_00137e80:
    uVar20 = (uint)(uVar30 >> 0x13) & 0x40 | (uint)(uVar30 >> 3) & 0xaa |
             (uint)(uVar30 >> 0xf) & 0x10 | puVar11[-1] >> 0x16 & 1 | puVar11[1] >> 0x14 & 4;
    bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
            [uVar20];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar25 = poVar7->qeval;
    uVar12 = uVar12 - uVar25;
    if (OVar24 >> 0x10 < uVar25) {
      uVar18 = (uint)(poVar7->mps == 0);
      if (uVar25 > uVar12) {
        uVar18 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar25 <= uVar12];
      uVar12 = uVar25;
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_00137f43;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_00137f43:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = OVar24 + uVar25 * -0x10000;
      if ((short)uVar12 < 0) {
        uVar18 = poVar7->mps;
      }
      else {
        uVar18 = (uint)(poVar7->mps == 0);
        if (uVar12 >= uVar25) {
          uVar18 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar12 < uVar25];
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_00137fe6;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_00137fe6:
          uVar12 = uVar12 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar12 < 0x8000);
      }
    }
    bVar6 = ""[uVar20];
    uVar25 = uVar17;
    if (uVar18 == bVar6) {
      uVar25 = uVar16;
    }
    puVar23[0x40] = uVar25;
    *(byte *)((long)puVar11 + -3) = *(byte *)((long)puVar11 + -3) | 1;
    uVar30 = (ulong)((uint)uVar30 | (uVar18 ^ bVar6) << 0x16 | 0x80);
    *(byte *)(puVar11 + 1) = (byte)puVar11[1] | 0x40;
    bVar34 = true;
  }
LAB_0013805b:
  if (bVar34) {
    bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar30 >> 6) & 0x1ef];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar25 = poVar7->qeval;
    uVar12 = uVar12 - uVar25;
    if (OVar24 >> 0x10 < uVar25) {
      uVar20 = (uint)(poVar7->mps == 0);
      if (uVar25 > uVar12) {
        uVar20 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar25 <= uVar12];
      uVar12 = uVar25;
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_001380ee;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_001380ee:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = OVar24 + uVar25 * -0x10000;
      if ((short)uVar12 < 0) {
        uVar20 = poVar7->mps;
      }
      else {
        uVar20 = (uint)(poVar7->mps == 0);
        if (uVar12 >= uVar25) {
          uVar20 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar12 < uVar25];
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_0013818a;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_0013818a:
          uVar12 = uVar12 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar12 < 0x8000);
      }
    }
    if (uVar20 != 0) goto LAB_001381c3;
    bVar34 = true;
  }
  else {
LAB_001381c3:
    uVar20 = (uint)(uVar30 >> 0x16) & 0x40 | (uint)(uVar30 >> 6) & 0xaa |
             (uint)(uVar30 >> 0x12) & 0x10 | puVar11[-1] >> 0x19 & 1 | puVar11[1] >> 0x17 & 4;
    bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
            [uVar20];
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar25 = poVar7->qeval;
    uVar12 = uVar12 - uVar25;
    if (OVar24 >> 0x10 < uVar25) {
      uVar18 = (uint)(poVar7->mps == 0);
      if (uVar25 > uVar12) {
        uVar18 = poVar7->mps;
      }
      (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar25 <= uVar12];
      uVar12 = uVar25;
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_00138286;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_00138286:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = OVar24 + uVar25 * -0x10000;
      if ((short)uVar12 < 0) {
        uVar18 = poVar7->mps;
      }
      else {
        uVar18 = (uint)(poVar7->mps == 0);
        if (uVar12 >= uVar25) {
          uVar18 = poVar7->mps;
        }
        (t1->mqc).ctxs[bVar6] = (&poVar7->nmps)[uVar12 < uVar25];
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_00138329;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_00138329:
          uVar12 = uVar12 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar12 < 0x8000);
      }
    }
    bVar6 = ""[uVar20];
    uVar25 = uVar17;
    if (uVar18 == bVar6) {
      uVar25 = uVar16;
    }
    puVar23[0x80] = uVar25;
    *(byte *)((long)puVar11 + -3) = *(byte *)((long)puVar11 + -3) | 8;
    uVar30 = (ulong)((uint)uVar30 | (uVar18 ^ bVar6) << 0x19 | 0x400);
    *(byte *)((long)puVar11 + 5) = *(byte *)((long)puVar11 + 5) | 2;
    bVar34 = true;
  }
LAB_00138399:
  uVar25 = (uint)uVar30;
  if (bVar34) {
    bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar30 >> 9) & 0x1ef];
    ppoVar15 = (t1->mqc).ctxs + bVar6;
    poVar7 = (t1->mqc).ctxs[bVar6];
    uVar20 = poVar7->qeval;
    uVar12 = uVar12 - uVar20;
    if (OVar24 >> 0x10 < uVar20) {
      uVar18 = (uint)(poVar7->mps == 0);
      if (uVar20 > uVar12) {
        uVar18 = poVar7->mps;
      }
      *ppoVar15 = (&poVar7->nmps)[uVar20 <= uVar12];
      uVar12 = uVar20;
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_0013843b;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_0013843b:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
    else {
      OVar24 = OVar24 + uVar20 * -0x10000;
      if ((short)uVar12 < 0) {
        uVar18 = poVar7->mps;
      }
      else {
        uVar18 = (uint)(poVar7->mps == 0);
        if (uVar12 >= uVar20) {
          uVar18 = poVar7->mps;
        }
        *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar20];
        do {
          if (OVar29 == 0) {
            pOVar8 = *ppOVar1;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                *ppOVar1 = pOVar8 + 1;
                OVar24 = OVar24 + (uint)bVar6 * 0x200;
                OVar29 = 7;
                goto LAB_001384e0;
              }
              OVar24 = OVar24 + 0xff00;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x100;
            }
            OVar29 = 8;
          }
LAB_001384e0:
          uVar12 = uVar12 * 2;
          OVar24 = OVar24 * 2;
          OVar29 = OVar29 - 1;
        } while (uVar12 < 0x8000);
      }
    }
    if (uVar18 == 0) goto switchD_00137090_default;
  }
  uVar18 = (uint)(uVar30 >> 0x19) & 0x40 | (uint)(uVar30 >> 9) & 0xaa |
           (uint)(uVar30 >> 0x15) & 0x10 | puVar11[-1] >> 0x1c & 1 | puVar11[1] >> 0x1a & 4;
  ppoVar15 = (t1->mqc).ctxs +
             "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
             [uVar18];
  poVar7 = *ppoVar15;
  uVar20 = poVar7->qeval;
  uVar12 = uVar12 - uVar20;
  if (OVar24 >> 0x10 < uVar20) {
    uVar32 = (uint)(poVar7->mps == 0);
    if (uVar20 > uVar12) {
      uVar32 = poVar7->mps;
    }
    *ppoVar15 = (&poVar7->nmps)[uVar20 <= uVar12];
    uVar12 = uVar20;
    do {
      if (OVar29 == 0) {
        pOVar8 = *ppOVar1;
        bVar6 = pOVar8[1];
        if (*pOVar8 == 0xff) {
          if (bVar6 < 0x90) {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x200;
            OVar29 = 7;
            goto LAB_001385dd;
          }
          OVar24 = OVar24 + 0xff00;
          *pOVar2 = *pOVar2 + 1;
        }
        else {
          *ppOVar1 = pOVar8 + 1;
          OVar24 = OVar24 + (uint)bVar6 * 0x100;
        }
        OVar29 = 8;
      }
LAB_001385dd:
      uVar12 = uVar12 * 2;
      OVar24 = OVar24 * 2;
      OVar29 = OVar29 - 1;
    } while (uVar12 < 0x8000);
  }
  else {
    OVar24 = OVar24 + uVar20 * -0x10000;
    if ((short)uVar12 < 0) {
      uVar32 = poVar7->mps;
    }
    else {
      uVar32 = (uint)(poVar7->mps == 0);
      if (uVar12 >= uVar20) {
        uVar32 = poVar7->mps;
      }
      *ppoVar15 = (&poVar7->nmps)[uVar12 < uVar20];
      do {
        if (OVar29 == 0) {
          pOVar8 = *ppOVar1;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              *ppOVar1 = pOVar8 + 1;
              OVar24 = OVar24 + (uint)bVar6 * 0x200;
              OVar29 = 7;
              goto LAB_0013867a;
            }
            OVar24 = OVar24 + 0xff00;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            *ppOVar1 = pOVar8 + 1;
            OVar24 = OVar24 + (uint)bVar6 * 0x100;
          }
          OVar29 = 8;
        }
LAB_0013867a:
        uVar12 = uVar12 * 2;
        OVar24 = OVar24 * 2;
        OVar29 = OVar29 - 1;
      } while (uVar12 < 0x8000);
    }
  }
  uVar19 = uVar32 ^ ""[uVar18];
  uVar20 = uVar17;
  if (uVar32 == ""[uVar18]) {
    uVar20 = uVar16;
  }
  puVar23[0xc0] = uVar20;
  *(byte *)((long)puVar11 + -3) = *(byte *)((long)puVar11 + -3) | 0x40;
  *(byte *)((long)puVar11 + 5) = *(byte *)((long)puVar11 + 5) | 0x10;
  puVar11[0x42] = uVar19 << 0x12 | puVar11[0x42] | 2;
  *(byte *)(puVar11 + 0x41) = (byte)puVar11[0x41] | 4;
  uVar25 = uVar25 | uVar19 << 0x1c | 0x2000;
  *(byte *)(puVar11 + 0x43) = (byte)puVar11[0x43] | 1;
switchD_00137090_default:
  if (OVar26 != 0) goto LAB_00138718;
LAB_00138723:
  iVar33 = iVar33 + 1;
  puVar10 = puVar11 + 1;
  puVar14 = puVar23 + 1;
  if (iVar33 == 0x40) goto LAB_0013874d;
  goto LAB_001369af;
LAB_0013874d:
  puVar14 = puVar23 + 0xc1;
  puVar10 = puVar11 + 3;
  bVar34 = 0x3b < uVar27;
  uVar27 = uVar27 + 4;
  if (bVar34) goto LAB_0013e02b;
  goto LAB_001369a7;
LAB_0013e02b:
  (t1->mqc).curctx = ppoVar15;
  (t1->mqc).c = OVar24;
  (t1->mqc).a = uVar12;
  (t1->mqc).ct = OVar29;
  goto LAB_0013e041;
}

Assistant:

static void opj_t1_dec_clnpass(
    opj_t1_t *t1,
    OPJ_INT32 bpno,
    OPJ_INT32 cblksty)
{
    if (t1->w == 64 && t1->h == 64) {
        if (cblksty & J2K_CCP_CBLKSTY_VSC) {
            opj_t1_dec_clnpass_64x64_vsc(t1, bpno);
        } else {
            opj_t1_dec_clnpass_64x64_novsc(t1, bpno);
        }
    } else {
        if (cblksty & J2K_CCP_CBLKSTY_VSC) {
            opj_t1_dec_clnpass_generic_vsc(t1, bpno);
        } else {
            opj_t1_dec_clnpass_generic_novsc(t1, bpno);
        }
    }
    opj_t1_dec_clnpass_check_segsym(t1, cblksty);
}